

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O3

Vec3<embree::vfloat_impl<8>_> *
embree::avx::patchEval<embree::vfloat_impl<8>>
          (SubdivPatch1Base *patch,vfloat_impl<8> *uu,vfloat_impl<8> *vv)

{
  undefined1 auVar1 [32];
  uchar uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  Vec3<embree::vfloat_impl<8>_> *in_RDI;
  float fVar19;
  float fVar25;
  undefined1 auVar20 [16];
  float fVar23;
  float fVar24;
  float fVar26;
  float fVar28;
  float fVar30;
  undefined1 auVar21 [32];
  float fVar27;
  float fVar29;
  float fVar31;
  float fVar32;
  undefined1 auVar22 [32];
  float fVar33;
  float fVar34;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float in_register_0000125c;
  float fVar55;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float in_register_0000129c;
  undefined1 auVar57 [32];
  float fVar64;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float in_register_000012dc;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar73;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float in_register_0000139c;
  undefined1 auVar92 [32];
  float fVar99;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [32];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float in_register_0000141c;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float in_register_0000145c;
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar126 [28];
  float fVar132;
  float in_register_0000149c;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float in_register_000015dc;
  undefined1 auVar141 [32];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  
  uVar2 = patch->type;
  if (uVar2 == '\x02') {
    auVar21._8_4_ = 0x3f800000;
    auVar21._0_8_ = 0x3f8000003f800000;
    auVar21._12_4_ = 0x3f800000;
    auVar21._16_4_ = 0x3f800000;
    auVar21._20_4_ = 0x3f800000;
    auVar21._24_4_ = 0x3f800000;
    auVar21._28_4_ = 0x3f800000;
    auVar38 = *(undefined1 (*) [32])(uu->field_0).v;
    auVar8 = vsubps_avx(auVar21,auVar38);
    auVar1 = *(undefined1 (*) [32])(vv->field_0).v;
    auVar9 = vsubps_avx(auVar21,auVar1);
    fVar34 = auVar8._0_4_;
    fVar43 = auVar8._4_4_;
    fVar49 = auVar8._8_4_;
    fVar54 = auVar8._12_4_;
    fVar27 = auVar8._16_4_;
    fVar29 = auVar8._20_4_;
    fVar31 = auVar8._24_4_;
    fVar33 = fVar34 * fVar34 * fVar34;
    fVar39 = fVar43 * fVar43 * fVar43;
    fVar42 = fVar49 * fVar49 * fVar49;
    fVar45 = fVar54 * fVar54 * fVar54;
    fVar48 = fVar27 * fVar27 * fVar27;
    fVar51 = fVar29 * fVar29 * fVar29;
    fVar53 = fVar31 * fVar31 * fVar31;
    fVar40 = auVar9._0_4_;
    fVar46 = auVar9._4_4_;
    fVar52 = auVar9._8_4_;
    fVar55 = auVar9._12_4_;
    fVar112 = auVar9._16_4_;
    fVar114 = auVar9._20_4_;
    fVar138 = auVar9._24_4_;
    fVar19 = fVar40 * fVar40 * fVar40;
    fVar23 = fVar46 * fVar46 * fVar46;
    fVar24 = fVar52 * fVar52 * fVar52;
    fVar25 = fVar55 * fVar55 * fVar55;
    fVar26 = fVar112 * fVar112 * fVar112;
    fVar28 = fVar114 * fVar114 * fVar114;
    fVar30 = fVar138 * fVar138 * fVar138;
    fVar32 = 1.0;
    fVar99 = auVar38._0_4_;
    fVar101 = auVar38._4_4_;
    fVar102 = auVar38._8_4_;
    fVar103 = auVar38._12_4_;
    fVar104 = auVar38._16_4_;
    fVar105 = auVar38._20_4_;
    fVar106 = auVar38._24_4_;
    fVar64 = fVar34 * fVar99 * fVar34 * 3.0;
    fVar67 = fVar43 * fVar101 * fVar43 * 3.0;
    fVar68 = fVar49 * fVar102 * fVar49 * 3.0;
    fVar69 = fVar54 * fVar103 * fVar54 * 3.0;
    fVar70 = fVar27 * fVar104 * fVar27 * 3.0;
    fVar71 = fVar29 * fVar105 * fVar29 * 3.0;
    fVar72 = fVar31 * fVar106 * fVar31 * 3.0;
    fVar84 = auVar1._0_4_;
    fVar85 = auVar1._4_4_;
    fVar86 = auVar1._8_4_;
    fVar87 = auVar1._12_4_;
    fVar88 = auVar1._16_4_;
    fVar89 = auVar1._20_4_;
    fVar90 = auVar1._24_4_;
    fVar56 = fVar84 * fVar40 * fVar40 * 3.0;
    fVar58 = fVar85 * fVar46 * fVar46 * 3.0;
    fVar59 = fVar86 * fVar52 * fVar52 * 3.0;
    fVar60 = fVar87 * fVar55 * fVar55 * 3.0;
    fVar61 = fVar88 * fVar112 * fVar112 * 3.0;
    fVar62 = fVar89 * fVar114 * fVar114 * 3.0;
    fVar63 = fVar90 * fVar138 * fVar138 * 3.0;
    fVar91 = fVar99 * fVar99 * fVar34 * 3.0;
    fVar93 = fVar101 * fVar101 * fVar43 * 3.0;
    fVar94 = fVar102 * fVar102 * fVar49 * 3.0;
    fVar95 = fVar103 * fVar103 * fVar54 * 3.0;
    fVar96 = fVar104 * fVar104 * fVar27 * 3.0;
    fVar97 = fVar105 * fVar105 * fVar29 * 3.0;
    fVar98 = fVar106 * fVar106 * fVar31 * 3.0;
    fVar73 = fVar84 * fVar84 * fVar40 * 3.0;
    fVar78 = fVar85 * fVar85 * fVar46 * 3.0;
    fVar79 = fVar86 * fVar86 * fVar52 * 3.0;
    fVar80 = fVar87 * fVar87 * fVar55 * 3.0;
    fVar81 = fVar88 * fVar88 * fVar112 * 3.0;
    fVar82 = fVar89 * fVar89 * fVar114 * 3.0;
    fVar83 = fVar90 * fVar90 * fVar138 * 3.0;
    fVar99 = fVar99 * fVar99 * fVar99;
    fVar101 = fVar101 * fVar101 * fVar101;
    fVar102 = fVar102 * fVar102 * fVar102;
    fVar103 = fVar103 * fVar103 * fVar103;
    fVar104 = fVar104 * fVar104 * fVar104;
    fVar105 = fVar105 * fVar105 * fVar105;
    fVar106 = fVar106 * fVar106 * fVar106;
    fVar84 = fVar84 * fVar84 * fVar84;
    fVar85 = fVar85 * fVar85 * fVar85;
    fVar86 = fVar86 * fVar86 * fVar86;
    fVar87 = fVar87 * fVar87 * fVar87;
    fVar88 = fVar88 * fVar88 * fVar88;
    fVar89 = fVar89 * fVar89 * fVar89;
    fVar90 = fVar90 * fVar90 * fVar90;
    fVar34 = patch->patch_v[0][0].field_0.m128[0];
    fVar40 = patch->patch_v[0][1].field_0.m128[0];
    fVar43 = patch->patch_v[0][2].field_0.m128[0];
    fVar46 = patch->patch_v[0][3].field_0.m128[0];
    fVar49 = patch->patch_v[1][0].field_0.m128[0];
    fVar52 = patch->patch_v[1][1].field_0.m128[0];
    fVar54 = patch->patch_v[1][2].field_0.m128[0];
    fVar55 = patch->patch_v[1][3].field_0.m128[0];
    fVar27 = patch->patch_v[2][0].field_0.m128[0];
    fVar112 = patch->patch_v[2][1].field_0.m128[0];
    fVar29 = patch->patch_v[2][2].field_0.m128[0];
    fVar114 = patch->patch_v[2][3].field_0.m128[0];
    fVar137 = fVar112 + fVar29 + fVar114;
    fVar31 = patch->patch_v[3][0].field_0.m128[0];
    fVar138 = patch->patch_v[3][1].field_0.m128[0];
    fVar41 = patch->patch_v[3][2].field_0.m128[0];
    fVar44 = patch->patch_v[3][3].field_0.m128[0];
    fVar47 = patch->patch_v[0][0].field_0.m128[1];
    fVar50 = patch->patch_v[0][1].field_0.m128[1];
    fVar124 = patch->patch_v[0][2].field_0.m128[1];
    fVar107 = (fVar34 * fVar33 + fVar40 * fVar64 + fVar43 * fVar91 + fVar46 * fVar99) * fVar19 +
              (fVar49 * fVar33 + fVar52 * fVar64 + fVar54 * fVar91 + fVar55 * fVar99) * fVar56 +
              (fVar27 * fVar33 + fVar112 * fVar64 + fVar29 * fVar91 + fVar114 * fVar99) * fVar73 +
              (fVar31 * fVar33 + fVar138 * fVar64 + fVar41 * fVar91 + fVar44 * fVar99) * fVar84;
    fVar108 = (fVar34 * fVar39 + fVar40 * fVar67 + fVar43 * fVar93 + fVar46 * fVar101) * fVar23 +
              (fVar49 * fVar39 + fVar52 * fVar67 + fVar54 * fVar93 + fVar55 * fVar101) * fVar58 +
              (fVar27 * fVar39 + fVar112 * fVar67 + fVar29 * fVar93 + fVar114 * fVar101) * fVar78 +
              (fVar31 * fVar39 + fVar138 * fVar67 + fVar41 * fVar93 + fVar44 * fVar101) * fVar85;
    fVar109 = (fVar34 * fVar42 + fVar40 * fVar68 + fVar43 * fVar94 + fVar46 * fVar102) * fVar24 +
              (fVar49 * fVar42 + fVar52 * fVar68 + fVar54 * fVar94 + fVar55 * fVar102) * fVar59 +
              (fVar27 * fVar42 + fVar112 * fVar68 + fVar29 * fVar94 + fVar114 * fVar102) * fVar79 +
              (fVar31 * fVar42 + fVar138 * fVar68 + fVar41 * fVar94 + fVar44 * fVar102) * fVar86;
    fVar110 = (fVar34 * fVar45 + fVar40 * fVar69 + fVar43 * fVar95 + fVar46 * fVar103) * fVar25 +
              (fVar49 * fVar45 + fVar52 * fVar69 + fVar54 * fVar95 + fVar55 * fVar103) * fVar60 +
              (fVar27 * fVar45 + fVar112 * fVar69 + fVar29 * fVar95 + fVar114 * fVar103) * fVar80 +
              (fVar31 * fVar45 + fVar138 * fVar69 + fVar41 * fVar95 + fVar44 * fVar103) * fVar87;
    fVar111 = (fVar34 * fVar48 + fVar40 * fVar70 + fVar43 * fVar96 + fVar46 * fVar104) * fVar26 +
              (fVar49 * fVar48 + fVar52 * fVar70 + fVar54 * fVar96 + fVar55 * fVar104) * fVar61 +
              (fVar27 * fVar48 + fVar112 * fVar70 + fVar29 * fVar96 + fVar114 * fVar104) * fVar81 +
              (fVar31 * fVar48 + fVar138 * fVar70 + fVar41 * fVar96 + fVar44 * fVar104) * fVar88;
    fVar113 = (fVar34 * fVar51 + fVar40 * fVar71 + fVar43 * fVar97 + fVar46 * fVar105) * fVar28 +
              (fVar49 * fVar51 + fVar52 * fVar71 + fVar54 * fVar97 + fVar55 * fVar105) * fVar62 +
              (fVar27 * fVar51 + fVar112 * fVar71 + fVar29 * fVar97 + fVar114 * fVar105) * fVar82 +
              (fVar31 * fVar51 + fVar138 * fVar71 + fVar41 * fVar97 + fVar44 * fVar105) * fVar89;
    fVar115 = (fVar34 * fVar53 + fVar40 * fVar72 + fVar43 * fVar98 + fVar46 * fVar106) * fVar30 +
              (fVar49 * fVar53 + fVar52 * fVar72 + fVar54 * fVar98 + fVar55 * fVar106) * fVar63 +
              (fVar27 * fVar53 + fVar112 * fVar72 + fVar29 * fVar98 + fVar114 * fVar106) * fVar83 +
              (fVar31 * fVar53 + fVar138 * fVar72 + fVar41 * fVar98 + fVar44 * fVar106) * fVar90;
    fVar116 = fVar34 + fVar40 + fVar43 + fVar46 +
              fVar49 + fVar52 + fVar54 + fVar55 +
              fVar27 + fVar137 + fVar31 + fVar138 + fVar41 + fVar137;
    fVar34 = patch->patch_v[0][3].field_0.m128[1];
    fVar40 = patch->patch_v[1][0].field_0.m128[1];
    fVar43 = patch->patch_v[1][1].field_0.m128[1];
    fVar46 = patch->patch_v[1][2].field_0.m128[1];
    fVar49 = patch->patch_v[1][3].field_0.m128[1];
    fVar138 = fVar43 + fVar46 + fVar49;
    fVar52 = patch->patch_v[2][0].field_0.m128[1];
    fVar54 = patch->patch_v[2][1].field_0.m128[1];
    fVar55 = patch->patch_v[2][2].field_0.m128[1];
    fVar27 = patch->patch_v[2][3].field_0.m128[1];
    fVar112 = patch->patch_v[3][0].field_0.m128[1];
    fVar29 = patch->patch_v[3][1].field_0.m128[1];
    fVar114 = patch->patch_v[3][2].field_0.m128[1];
    fVar31 = patch->patch_v[3][3].field_0.m128[1];
    fVar117 = (fVar47 * fVar33 + fVar50 * fVar64 + fVar124 * fVar91 + fVar34 * fVar99) * fVar19 +
              (fVar40 * fVar33 + fVar43 * fVar64 + fVar46 * fVar91 + fVar49 * fVar99) * fVar56 +
              (fVar52 * fVar33 + fVar54 * fVar64 + fVar55 * fVar91 + fVar27 * fVar99) * fVar73 +
              (fVar112 * fVar33 + fVar29 * fVar64 + fVar114 * fVar91 + fVar31 * fVar99) * fVar84;
    fVar118 = (fVar47 * fVar39 + fVar50 * fVar67 + fVar124 * fVar93 + fVar34 * fVar101) * fVar23 +
              (fVar40 * fVar39 + fVar43 * fVar67 + fVar46 * fVar93 + fVar49 * fVar101) * fVar58 +
              (fVar52 * fVar39 + fVar54 * fVar67 + fVar55 * fVar93 + fVar27 * fVar101) * fVar78 +
              (fVar112 * fVar39 + fVar29 * fVar67 + fVar114 * fVar93 + fVar31 * fVar101) * fVar85;
    fVar119 = (fVar47 * fVar42 + fVar50 * fVar68 + fVar124 * fVar94 + fVar34 * fVar102) * fVar24 +
              (fVar40 * fVar42 + fVar43 * fVar68 + fVar46 * fVar94 + fVar49 * fVar102) * fVar59 +
              (fVar52 * fVar42 + fVar54 * fVar68 + fVar55 * fVar94 + fVar27 * fVar102) * fVar79 +
              (fVar112 * fVar42 + fVar29 * fVar68 + fVar114 * fVar94 + fVar31 * fVar102) * fVar86;
    fVar120 = (fVar47 * fVar45 + fVar50 * fVar69 + fVar124 * fVar95 + fVar34 * fVar103) * fVar25 +
              (fVar40 * fVar45 + fVar43 * fVar69 + fVar46 * fVar95 + fVar49 * fVar103) * fVar60 +
              (fVar52 * fVar45 + fVar54 * fVar69 + fVar55 * fVar95 + fVar27 * fVar103) * fVar80 +
              (fVar112 * fVar45 + fVar29 * fVar69 + fVar114 * fVar95 + fVar31 * fVar103) * fVar87;
    fVar121 = (fVar47 * fVar48 + fVar50 * fVar70 + fVar124 * fVar96 + fVar34 * fVar104) * fVar26 +
              (fVar40 * fVar48 + fVar43 * fVar70 + fVar46 * fVar96 + fVar49 * fVar104) * fVar61 +
              (fVar52 * fVar48 + fVar54 * fVar70 + fVar55 * fVar96 + fVar27 * fVar104) * fVar81 +
              (fVar112 * fVar48 + fVar29 * fVar70 + fVar114 * fVar96 + fVar31 * fVar104) * fVar88;
    fVar122 = (fVar47 * fVar51 + fVar50 * fVar71 + fVar124 * fVar97 + fVar34 * fVar105) * fVar28 +
              (fVar40 * fVar51 + fVar43 * fVar71 + fVar46 * fVar97 + fVar49 * fVar105) * fVar62 +
              (fVar52 * fVar51 + fVar54 * fVar71 + fVar55 * fVar97 + fVar27 * fVar105) * fVar82 +
              (fVar112 * fVar51 + fVar29 * fVar71 + fVar114 * fVar97 + fVar31 * fVar105) * fVar89;
    fVar123 = (fVar47 * fVar53 + fVar50 * fVar72 + fVar124 * fVar98 + fVar34 * fVar106) * fVar30 +
              (fVar40 * fVar53 + fVar43 * fVar72 + fVar46 * fVar98 + fVar49 * fVar106) * fVar63 +
              (fVar52 * fVar53 + fVar54 * fVar72 + fVar55 * fVar98 + fVar27 * fVar106) * fVar83 +
              (fVar112 * fVar53 + fVar29 * fVar72 + fVar114 * fVar98 + fVar31 * fVar106) * fVar90;
    fVar124 = fVar47 + fVar50 + fVar124 + fVar34 +
              fVar40 + fVar138 +
              fVar52 + fVar54 + fVar55 + fVar138 + fVar112 + fVar29 + fVar114 + fVar31;
    fVar34 = patch->patch_v[0][0].field_0.m128[2];
    fVar40 = patch->patch_v[0][1].field_0.m128[2];
    fVar43 = patch->patch_v[0][2].field_0.m128[2];
    fVar46 = patch->patch_v[0][3].field_0.m128[2];
    fVar54 = patch->patch_v[1][0].field_0.m128[2];
    fVar55 = patch->patch_v[1][1].field_0.m128[2];
    fVar27 = patch->patch_v[1][2].field_0.m128[2];
    fVar112 = patch->patch_v[1][3].field_0.m128[2];
    auVar126._0_4_ = fVar34 * fVar33 + fVar40 * fVar64 + fVar43 * fVar91 + fVar46 * fVar99;
    auVar126._4_4_ = fVar34 * fVar39 + fVar40 * fVar67 + fVar43 * fVar93 + fVar46 * fVar101;
    auVar126._8_4_ = fVar34 * fVar42 + fVar40 * fVar68 + fVar43 * fVar94 + fVar46 * fVar102;
    auVar126._12_4_ = fVar34 * fVar45 + fVar40 * fVar69 + fVar43 * fVar95 + fVar46 * fVar103;
    auVar126._16_4_ = fVar34 * fVar48 + fVar40 * fVar70 + fVar43 * fVar96 + fVar46 * fVar104;
    auVar126._20_4_ = fVar34 * fVar51 + fVar40 * fVar71 + fVar43 * fVar97 + fVar46 * fVar105;
    auVar126._24_4_ = fVar34 * fVar53 + fVar40 * fVar72 + fVar43 * fVar98 + fVar46 * fVar106;
    fVar29 = patch->patch_v[2][0].field_0.m128[2];
    fVar114 = patch->patch_v[2][2].field_0.m128[2];
    fVar31 = patch->patch_v[2][3].field_0.m128[2];
    fVar138 = patch->patch_v[2][1].field_0.m128[2];
    fVar41 = patch->patch_v[3][3].field_0.m128[2];
    fVar44 = patch->patch_v[3][2].field_0.m128[2];
    fVar47 = patch->patch_v[3][1].field_0.m128[2];
    fVar137 = in_register_000012dc + in_register_0000139c + 3.0;
    fVar50 = patch->patch_v[3][0].field_0.m128[2];
    fVar34 = (fVar54 * fVar33 + fVar55 * fVar64 + fVar27 * fVar91 + fVar112 * fVar99) * fVar56 +
             (fVar29 * fVar33 + fVar138 * fVar64 + fVar114 * fVar91 + fVar31 * fVar99) * fVar73 +
             fVar84 * (fVar33 * fVar50 + fVar64 * fVar47 + fVar44 * fVar91 + fVar41 * fVar99);
    fVar40 = (fVar54 * fVar39 + fVar55 * fVar67 + fVar27 * fVar93 + fVar112 * fVar101) * fVar58 +
             (fVar29 * fVar39 + fVar138 * fVar67 + fVar114 * fVar93 + fVar31 * fVar101) * fVar78 +
             fVar85 * (fVar39 * fVar50 + fVar67 * fVar47 + fVar44 * fVar93 + fVar41 * fVar101);
    fVar43 = (fVar54 * fVar42 + fVar55 * fVar68 + fVar27 * fVar94 + fVar112 * fVar102) * fVar59 +
             (fVar29 * fVar42 + fVar138 * fVar68 + fVar114 * fVar94 + fVar31 * fVar102) * fVar79 +
             fVar86 * (fVar42 * fVar50 + fVar68 * fVar47 + fVar44 * fVar94 + fVar41 * fVar102);
    fVar46 = (fVar54 * fVar45 + fVar55 * fVar69 + fVar27 * fVar95 + fVar112 * fVar103) * fVar60 +
             (fVar29 * fVar45 + fVar138 * fVar69 + fVar114 * fVar95 + fVar31 * fVar103) * fVar80 +
             fVar87 * (fVar45 * fVar50 + fVar69 * fVar47 + fVar44 * fVar95 + fVar41 * fVar103);
    fVar49 = (fVar54 * fVar48 + fVar55 * fVar70 + fVar27 * fVar96 + fVar112 * fVar104) * fVar61 +
             (fVar29 * fVar48 + fVar138 * fVar70 + fVar114 * fVar96 + fVar31 * fVar104) * fVar81 +
             fVar88 * (fVar48 * fVar50 + fVar70 * fVar47 + fVar44 * fVar96 + fVar41 * fVar104);
    fVar52 = (fVar54 * fVar51 + fVar55 * fVar71 + fVar27 * fVar97 + fVar112 * fVar105) * fVar62 +
             (fVar29 * fVar51 + fVar138 * fVar71 + fVar114 * fVar97 + fVar31 * fVar105) * fVar82 +
             fVar89 * (fVar51 * fVar50 + fVar71 * fVar47 + fVar44 * fVar97 + fVar41 * fVar105);
    fVar54 = (fVar54 * fVar53 + fVar55 * fVar72 + fVar27 * fVar98 + fVar112 * fVar106) * fVar63 +
             (fVar29 * fVar53 + fVar138 * fVar72 + fVar114 * fVar98 + fVar31 * fVar106) * fVar83 +
             fVar90 * (fVar53 * fVar50 + fVar72 * fVar47 + fVar44 * fVar98 + fVar41 * fVar106);
    fVar55 = auVar8._28_4_ + fVar137 + in_register_0000125c + fVar137;
  }
  else {
    if (uVar2 != '\x01') {
      if (uVar2 == '\x03') {
        fVar32 = patch->patch_v[0][0].field_0.m128[3];
        fVar34 = patch->patch_v[0][1].field_0.m128[3];
        fVar40 = patch->patch_v[0][2].field_0.m128[3];
        fVar43 = patch->patch_v[1][0].field_0.m128[3];
        fVar46 = patch->patch_v[1][1].field_0.m128[3];
        auVar38 = *(undefined1 (*) [32])(uu->field_0).v;
        auVar35._8_4_ = 0x3f800000;
        auVar35._0_8_ = 0x3f8000003f800000;
        auVar35._12_4_ = 0x3f800000;
        auVar35._16_4_ = 0x3f800000;
        auVar35._20_4_ = 0x3f800000;
        auVar35._24_4_ = 0x3f800000;
        auVar35._28_4_ = 0x3f800000;
        auVar1 = vcmpps_avx(auVar38,ZEXT832(0),0);
        auVar8 = vcmpps_avx(auVar38,auVar35,0);
        auVar7 = vorps_avx(auVar8,auVar1);
        auVar1 = *(undefined1 (*) [32])(vv->field_0).v;
        auVar8 = vcmpps_avx(auVar1,ZEXT832(0),0);
        auVar9 = vcmpps_avx(auVar1,auVar35,0);
        auVar8 = vorps_avx(auVar9,auVar8);
        auVar22 = vorps_avx(auVar7,auVar8);
        local_148._4_4_ = patch->patch_v[1][1].field_0.m128[0];
        local_148._0_4_ = local_148._4_4_;
        fStack_140 = (float)local_148._4_4_;
        fStack_13c = (float)local_148._4_4_;
        fStack_138 = (float)local_148._4_4_;
        fStack_134 = (float)local_148._4_4_;
        fStack_130 = (float)local_148._4_4_;
        fStack_12c = (float)local_148._4_4_;
        local_168._4_4_ = patch->patch_v[1][1].field_0.m128[1];
        local_168._0_4_ = local_168._4_4_;
        fStack_160 = (float)local_168._4_4_;
        fStack_15c = (float)local_168._4_4_;
        fStack_158 = (float)local_168._4_4_;
        fStack_154 = (float)local_168._4_4_;
        fStack_150 = (float)local_168._4_4_;
        fStack_14c = (float)local_168._4_4_;
        local_188._4_4_ = patch->patch_v[1][1].field_0.m128[2];
        local_188._0_4_ = local_188._4_4_;
        fStack_180 = (float)local_188._4_4_;
        fStack_17c = (float)local_188._4_4_;
        fStack_178 = (float)local_188._4_4_;
        fStack_174 = (float)local_188._4_4_;
        fStack_170 = (float)local_188._4_4_;
        fStack_16c = (float)local_188._4_4_;
        local_208._4_4_ = patch->patch_v[1][2].field_0.m128[0];
        local_208._0_4_ = local_208._4_4_;
        fStack_200 = (float)local_208._4_4_;
        fStack_1fc = (float)local_208._4_4_;
        fStack_1f8 = (float)local_208._4_4_;
        fStack_1f4 = (float)local_208._4_4_;
        fStack_1f0 = (float)local_208._4_4_;
        fStack_1ec = (float)local_208._4_4_;
        fVar49 = patch->patch_v[1][2].field_0.m128[1];
        fVar90 = auVar38._0_4_;
        fVar93 = auVar38._4_4_;
        fVar95 = auVar38._8_4_;
        fVar97 = auVar38._12_4_;
        fVar108 = auVar38._16_4_;
        fVar110 = auVar38._20_4_;
        fVar113 = auVar38._24_4_;
        fVar91 = auVar1._0_4_;
        fVar94 = auVar1._4_4_;
        fVar96 = auVar1._8_4_;
        fVar107 = auVar1._12_4_;
        fVar109 = auVar1._16_4_;
        fVar111 = auVar1._20_4_;
        fVar115 = auVar1._24_4_;
        fVar137 = fVar40 + auVar7._28_4_;
        auVar92._0_4_ = fVar91 + fVar90;
        auVar92._4_4_ = fVar94 + fVar93;
        auVar92._8_4_ = fVar96 + fVar95;
        auVar92._12_4_ = fVar107 + fVar97;
        auVar92._16_4_ = fVar109 + fVar108;
        auVar92._20_4_ = fVar111 + fVar110;
        auVar92._24_4_ = fVar115 + fVar113;
        auVar92._28_4_ = auVar1._28_4_ + auVar38._28_4_;
        auVar8 = vrcpps_avx(auVar92);
        fVar52 = auVar8._0_4_;
        fVar54 = auVar8._4_4_;
        auVar9._4_4_ = fVar54 * auVar92._4_4_;
        auVar9._0_4_ = fVar52 * auVar92._0_4_;
        fVar55 = auVar8._8_4_;
        auVar9._8_4_ = fVar55 * auVar92._8_4_;
        fVar27 = auVar8._12_4_;
        auVar9._12_4_ = fVar27 * auVar92._12_4_;
        fVar112 = auVar8._16_4_;
        auVar9._16_4_ = fVar112 * auVar92._16_4_;
        fVar29 = auVar8._20_4_;
        auVar9._20_4_ = fVar29 * auVar92._20_4_;
        fVar114 = auVar8._24_4_;
        auVar9._24_4_ = fVar114 * auVar92._24_4_;
        auVar9._28_4_ = auVar92._28_4_;
        auVar9 = vsubps_avx(auVar35,auVar9);
        fVar52 = fVar52 + fVar52 * auVar9._0_4_;
        fVar54 = fVar54 + fVar54 * auVar9._4_4_;
        fVar55 = fVar55 + fVar55 * auVar9._8_4_;
        fVar27 = fVar27 + fVar27 * auVar9._12_4_;
        fVar112 = fVar112 + fVar112 * auVar9._16_4_;
        fVar29 = fVar29 + fVar29 * auVar9._20_4_;
        fVar114 = fVar114 + fVar114 * auVar9._24_4_;
        auVar9 = vsubps_avx(auVar35,auVar38);
        local_1a8._4_4_ = (fVar94 * fVar32 + fVar93 * (float)local_148._4_4_) * fVar54;
        local_1a8._0_4_ = (fVar91 * fVar32 + fVar90 * (float)local_148._4_4_) * fVar52;
        fStack_1a0 = (fVar96 * fVar32 + fVar95 * (float)local_148._4_4_) * fVar55;
        fStack_19c = (fVar107 * fVar32 + fVar97 * (float)local_148._4_4_) * fVar27;
        fStack_198 = (fVar109 * fVar32 + fVar108 * (float)local_148._4_4_) * fVar112;
        fStack_194 = (fVar111 * fVar32 + fVar110 * (float)local_148._4_4_) * fVar29;
        fStack_190 = (fVar115 * fVar32 + fVar113 * (float)local_148._4_4_) * fVar114;
        fStack_18c = (float)local_148._4_4_;
        local_1c8._4_4_ = ((float)local_168._4_4_ * fVar93 + fVar94 * fVar34) * fVar54;
        local_1c8._0_4_ = ((float)local_168._4_4_ * fVar90 + fVar91 * fVar34) * fVar52;
        fStack_1c0 = ((float)local_168._4_4_ * fVar95 + fVar96 * fVar34) * fVar55;
        fStack_1bc = ((float)local_168._4_4_ * fVar97 + fVar107 * fVar34) * fVar27;
        fStack_1b8 = ((float)local_168._4_4_ * fVar108 + fVar109 * fVar34) * fVar112;
        fStack_1b4 = ((float)local_168._4_4_ * fVar110 + fVar111 * fVar34) * fVar29;
        fStack_1b0 = ((float)local_168._4_4_ * fVar113 + fVar115 * fVar34) * fVar114;
        fStack_1ac = (float)local_148._4_4_;
        local_1e8._4_4_ = (fVar94 * fVar40 + (float)local_188._4_4_ * fVar93) * fVar54;
        local_1e8._0_4_ = (fVar91 * fVar40 + (float)local_188._4_4_ * fVar90) * fVar52;
        fStack_1e0 = (fVar96 * fVar40 + (float)local_188._4_4_ * fVar95) * fVar55;
        fStack_1dc = (fVar107 * fVar40 + (float)local_188._4_4_ * fVar97) * fVar27;
        fStack_1d8 = (fVar109 * fVar40 + (float)local_188._4_4_ * fVar108) * fVar112;
        fStack_1d4 = (fVar111 * fVar40 + (float)local_188._4_4_ * fVar110) * fVar29;
        fStack_1d0 = (fVar115 * fVar40 + (float)local_188._4_4_ * fVar113) * fVar114;
        fStack_1cc = (float)local_148._4_4_;
        fVar47 = auVar9._0_4_;
        fVar23 = auVar9._4_4_;
        fVar28 = auVar9._8_4_;
        fVar42 = auVar9._12_4_;
        fVar53 = auVar9._16_4_;
        fVar61 = auVar9._20_4_;
        fVar67 = auVar9._24_4_;
        fVar72 = (float)local_148._4_4_ + fVar137;
        fVar32 = patch->patch_v[1][2].field_0.m128[3];
        fVar34 = patch->patch_v[1][2].field_0.m128[2];
        auVar74._0_4_ = fVar47 + fVar91;
        auVar74._4_4_ = fVar23 + fVar94;
        auVar74._8_4_ = fVar28 + fVar96;
        auVar74._12_4_ = fVar42 + fVar107;
        auVar74._16_4_ = fVar53 + fVar109;
        auVar74._20_4_ = fVar61 + fVar111;
        auVar74._24_4_ = fVar67 + fVar115;
        fVar98 = auVar9._28_4_;
        auVar74._28_4_ = fVar98 + auVar1._28_4_;
        auVar9 = vrcpps_avx(auVar74);
        fVar50 = auVar9._0_4_;
        fVar24 = auVar9._4_4_;
        auVar7._4_4_ = auVar74._4_4_ * fVar24;
        auVar7._0_4_ = auVar74._0_4_ * fVar50;
        fVar30 = auVar9._8_4_;
        auVar7._8_4_ = auVar74._8_4_ * fVar30;
        fVar45 = auVar9._12_4_;
        auVar7._12_4_ = auVar74._12_4_ * fVar45;
        fVar56 = auVar9._16_4_;
        auVar7._16_4_ = auVar74._16_4_ * fVar56;
        fVar62 = auVar9._20_4_;
        auVar7._20_4_ = auVar74._20_4_ * fVar62;
        fVar68 = auVar9._24_4_;
        auVar7._24_4_ = auVar74._24_4_ * fVar68;
        auVar7._28_4_ = auVar74._28_4_;
        auVar9 = vsubps_avx(auVar35,auVar7);
        fVar50 = fVar50 + fVar50 * auVar9._0_4_;
        fVar24 = fVar24 + fVar24 * auVar9._4_4_;
        fVar30 = fVar30 + fVar30 * auVar9._8_4_;
        fVar45 = fVar45 + fVar45 * auVar9._12_4_;
        fVar56 = fVar56 + fVar56 * auVar9._16_4_;
        fVar62 = fVar62 + fVar62 * auVar9._20_4_;
        fVar68 = fVar68 + fVar68 * auVar9._24_4_;
        fVar40 = patch->patch_v[2][0].field_0.m128[3];
        fVar52 = patch->patch_v[2][1].field_0.m128[3];
        auVar1 = vsubps_avx(auVar35,auVar1);
        fVar81 = auVar1._0_4_;
        fVar86 = auVar1._4_4_;
        fVar116 = auVar1._8_4_;
        fVar133 = auVar1._12_4_;
        fVar134 = auVar1._16_4_;
        fVar135 = auVar1._20_4_;
        fVar136 = auVar1._24_4_;
        fVar54 = patch->patch_v[2][2].field_0.m128[0];
        fVar55 = patch->patch_v[2][2].field_0.m128[1];
        fVar27 = patch->patch_v[2][2].field_0.m128[3];
        fVar112 = patch->patch_v[2][2].field_0.m128[2];
        auVar139._4_4_ = fVar112;
        auVar139._0_4_ = fVar112;
        auVar139._8_4_ = fVar112;
        auVar139._12_4_ = fVar112;
        auVar139._16_4_ = fVar112;
        auVar139._20_4_ = fVar112;
        auVar139._24_4_ = fVar112;
        auVar139._28_4_ = fVar112;
        auVar36._0_4_ = fVar47 + fVar81;
        auVar36._4_4_ = fVar23 + fVar86;
        auVar36._8_4_ = fVar28 + fVar116;
        auVar36._12_4_ = fVar42 + fVar133;
        auVar36._16_4_ = fVar53 + fVar134;
        auVar36._20_4_ = fVar61 + fVar135;
        auVar36._24_4_ = fVar67 + fVar136;
        fVar60 = auVar1._28_4_;
        auVar36._28_4_ = fVar98 + fVar60;
        auVar74 = vrcpps_avx(auVar36);
        fVar124 = auVar74._0_4_;
        fVar25 = auVar74._4_4_;
        auVar1._4_4_ = auVar36._4_4_ * fVar25;
        auVar1._0_4_ = auVar36._0_4_ * fVar124;
        fVar33 = auVar74._8_4_;
        auVar1._8_4_ = auVar36._8_4_ * fVar33;
        fVar48 = auVar74._12_4_;
        auVar1._12_4_ = auVar36._12_4_ * fVar48;
        fVar58 = auVar74._16_4_;
        auVar1._16_4_ = auVar36._16_4_ * fVar58;
        fVar63 = auVar74._20_4_;
        auVar1._20_4_ = auVar36._20_4_ * fVar63;
        fVar69 = auVar74._24_4_;
        auVar1._24_4_ = auVar36._24_4_ * fVar69;
        auVar1._28_4_ = auVar36._28_4_;
        auVar35 = vsubps_avx(auVar35,auVar1);
        fVar124 = fVar124 + fVar124 * auVar35._0_4_;
        fVar25 = fVar25 + fVar25 * auVar35._4_4_;
        fVar33 = fVar33 + fVar33 * auVar35._8_4_;
        fVar48 = fVar48 + fVar48 * auVar35._12_4_;
        fVar58 = fVar58 + fVar58 * auVar35._16_4_;
        fVar63 = fVar63 + fVar63 * auVar35._20_4_;
        fVar69 = fVar69 + fVar69 * auVar35._24_4_;
        auVar4._4_4_ = (fVar86 * fVar40 + fVar23 * fVar54) * fVar25;
        auVar4._0_4_ = (fVar81 * fVar40 + fVar47 * fVar54) * fVar124;
        auVar4._8_4_ = (fVar116 * fVar40 + fVar28 * fVar54) * fVar33;
        auVar4._12_4_ = (fVar133 * fVar40 + fVar42 * fVar54) * fVar48;
        auVar4._16_4_ = (fVar134 * fVar40 + fVar53 * fVar54) * fVar58;
        auVar4._20_4_ = (fVar135 * fVar40 + fVar61 * fVar54) * fVar63;
        auVar4._24_4_ = (fVar136 * fVar40 + fVar67 * fVar54) * fVar69;
        auVar4._28_4_ = auVar8._28_4_;
        fVar29 = patch->patch_v[3][0].field_0.m128[3];
        fVar114 = patch->patch_v[3][1].field_0.m128[3];
        fVar31 = patch->patch_v[2][1].field_0.m128[0];
        auVar75._4_4_ = fVar31;
        auVar75._0_4_ = fVar31;
        auVar75._8_4_ = fVar31;
        auVar75._12_4_ = fVar31;
        auVar75._16_4_ = fVar31;
        auVar75._20_4_ = fVar31;
        auVar75._24_4_ = fVar31;
        auVar75._28_4_ = fVar31;
        fVar138 = patch->patch_v[2][1].field_0.m128[1];
        auVar141._4_4_ = fVar138;
        auVar141._0_4_ = fVar138;
        auVar141._8_4_ = fVar138;
        auVar141._12_4_ = fVar138;
        auVar141._16_4_ = fVar138;
        auVar141._20_4_ = fVar138;
        auVar141._24_4_ = fVar138;
        auVar141._28_4_ = fVar138;
        fVar41 = patch->patch_v[3][2].field_0.m128[3];
        fVar44 = patch->patch_v[2][1].field_0.m128[2];
        auVar65._4_4_ = fVar44;
        auVar65._0_4_ = fVar44;
        auVar65._8_4_ = fVar44;
        auVar65._12_4_ = fVar44;
        auVar65._16_4_ = fVar44;
        auVar65._20_4_ = fVar44;
        auVar65._24_4_ = fVar44;
        auVar65._28_4_ = fVar44;
        auVar37._0_4_ = fVar81 + fVar90;
        auVar37._4_4_ = fVar86 + fVar93;
        auVar37._8_4_ = fVar116 + fVar95;
        auVar37._12_4_ = fVar133 + fVar97;
        auVar37._16_4_ = fVar134 + fVar108;
        auVar37._20_4_ = fVar135 + fVar110;
        auVar37._24_4_ = fVar136 + fVar113;
        auVar37._28_4_ = fVar60 + auVar38._28_4_;
        auVar38 = vrcpps_avx(auVar37);
        fVar19 = auVar38._0_4_;
        fVar26 = auVar38._4_4_;
        auVar8._4_4_ = auVar37._4_4_ * fVar26;
        auVar8._0_4_ = auVar37._0_4_ * fVar19;
        fVar39 = auVar38._8_4_;
        auVar8._8_4_ = auVar37._8_4_ * fVar39;
        fVar51 = auVar38._12_4_;
        auVar8._12_4_ = auVar37._12_4_ * fVar51;
        fVar59 = auVar38._16_4_;
        auVar8._16_4_ = auVar37._16_4_ * fVar59;
        fVar64 = auVar38._20_4_;
        auVar8._20_4_ = auVar37._20_4_ * fVar64;
        fVar70 = auVar38._24_4_;
        auVar8._24_4_ = auVar37._24_4_ * fVar70;
        auVar8._28_4_ = auVar37._28_4_;
        auVar140._8_4_ = 0x3f800000;
        auVar140._0_8_ = 0x3f8000003f800000;
        auVar140._12_4_ = 0x3f800000;
        auVar140._16_4_ = 0x3f800000;
        auVar140._20_4_ = 0x3f800000;
        auVar140._24_4_ = 0x3f800000;
        auVar140._28_4_ = 0x3f800000;
        auVar1 = vsubps_avx(auVar140,auVar8);
        fVar71 = auVar1._28_4_;
        fVar19 = fVar19 + fVar19 * auVar1._0_4_;
        fVar26 = fVar26 + fVar26 * auVar1._4_4_;
        fVar39 = fVar39 + fVar39 * auVar1._8_4_;
        fVar51 = fVar51 + fVar51 * auVar1._12_4_;
        fVar59 = fVar59 + fVar59 * auVar1._16_4_;
        fVar64 = fVar64 + fVar64 * auVar1._20_4_;
        fVar70 = fVar70 + fVar70 * auVar1._24_4_;
        auVar6._4_4_ = (fVar86 * fVar31 + fVar29 * fVar93) * fVar26;
        auVar6._0_4_ = (fVar81 * fVar31 + fVar29 * fVar90) * fVar19;
        auVar6._8_4_ = (fVar116 * fVar31 + fVar29 * fVar95) * fVar39;
        auVar6._12_4_ = (fVar133 * fVar31 + fVar29 * fVar97) * fVar51;
        auVar6._16_4_ = (fVar134 * fVar31 + fVar29 * fVar108) * fVar59;
        auVar6._20_4_ = (fVar135 * fVar31 + fVar29 * fVar110) * fVar64;
        auVar6._24_4_ = (fVar136 * fVar31 + fVar29 * fVar113) * fVar70;
        auVar6._28_4_ = fVar71;
        auVar10._4_4_ = (fVar86 * fVar138 + fVar114 * fVar93) * fVar26;
        auVar10._0_4_ = (fVar81 * fVar138 + fVar114 * fVar90) * fVar19;
        auVar10._8_4_ = (fVar116 * fVar138 + fVar114 * fVar95) * fVar39;
        auVar10._12_4_ = (fVar133 * fVar138 + fVar114 * fVar97) * fVar51;
        auVar10._16_4_ = (fVar134 * fVar138 + fVar114 * fVar108) * fVar59;
        auVar10._20_4_ = (fVar135 * fVar138 + fVar114 * fVar110) * fVar64;
        auVar10._24_4_ = (fVar136 * fVar138 + fVar114 * fVar113) * fVar70;
        auVar10._28_4_ = in_register_000015dc + fVar40 + fVar32 + fVar34;
        auVar11._4_4_ = (fVar41 * fVar93 + fVar86 * fVar44) * fVar26;
        auVar11._0_4_ = (fVar41 * fVar90 + fVar81 * fVar44) * fVar19;
        auVar11._8_4_ = (fVar41 * fVar95 + fVar116 * fVar44) * fVar39;
        auVar11._12_4_ = (fVar41 * fVar97 + fVar133 * fVar44) * fVar51;
        auVar11._16_4_ = (fVar41 * fVar108 + fVar134 * fVar44) * fVar59;
        auVar11._20_4_ = (fVar41 * fVar110 + fVar135 * fVar44) * fVar64;
        auVar11._24_4_ = (fVar41 * fVar113 + fVar136 * fVar44) * fVar70;
        auVar11._28_4_ = auVar38._28_4_ + fVar71;
        auVar38 = vblendvps_avx(_local_1a8,_local_148,auVar22);
        auVar1 = vblendvps_avx(_local_1c8,_local_168,auVar22);
        auVar8 = vblendvps_avx(_local_1e8,_local_188,auVar22);
        auVar16._4_4_ = (fVar43 * fVar23 + fVar94 * (float)local_208._4_4_) * fVar24;
        auVar16._0_4_ = (fVar43 * fVar47 + fVar91 * (float)local_208._4_4_) * fVar50;
        auVar16._8_4_ = (fVar43 * fVar28 + fVar96 * (float)local_208._4_4_) * fVar30;
        auVar16._12_4_ = (fVar43 * fVar42 + fVar107 * (float)local_208._4_4_) * fVar45;
        auVar16._16_4_ = (fVar43 * fVar53 + fVar109 * (float)local_208._4_4_) * fVar56;
        auVar16._20_4_ = (fVar43 * fVar61 + fVar111 * (float)local_208._4_4_) * fVar62;
        auVar16._24_4_ = (fVar43 * fVar67 + fVar115 * (float)local_208._4_4_) * fVar68;
        auVar16._28_4_ = fVar72;
        auVar9 = vblendvps_avx(auVar16,_local_208,auVar22);
        auVar15._4_4_ = (fVar23 * fVar46 + fVar94 * fVar49) * fVar24;
        auVar15._0_4_ = (fVar47 * fVar46 + fVar91 * fVar49) * fVar50;
        auVar15._8_4_ = (fVar28 * fVar46 + fVar96 * fVar49) * fVar30;
        auVar15._12_4_ = (fVar42 * fVar46 + fVar107 * fVar49) * fVar45;
        auVar15._16_4_ = (fVar53 * fVar46 + fVar109 * fVar49) * fVar56;
        auVar15._20_4_ = (fVar61 * fVar46 + fVar111 * fVar49) * fVar62;
        auVar15._24_4_ = (fVar67 * fVar46 + fVar115 * fVar49) * fVar68;
        auVar15._28_4_ = fVar72;
        auVar18._4_4_ = fVar49;
        auVar18._0_4_ = fVar49;
        auVar18._8_4_ = fVar49;
        auVar18._12_4_ = fVar49;
        auVar18._16_4_ = fVar49;
        auVar18._20_4_ = fVar49;
        auVar18._24_4_ = fVar49;
        auVar18._28_4_ = fVar49;
        auVar7 = vblendvps_avx(auVar15,auVar18,auVar22);
        auVar3._4_4_ = (fVar23 * fVar32 + fVar94 * fVar34) * fVar24;
        auVar3._0_4_ = (fVar47 * fVar32 + fVar91 * fVar34) * fVar50;
        auVar3._8_4_ = (fVar28 * fVar32 + fVar96 * fVar34) * fVar30;
        auVar3._12_4_ = (fVar42 * fVar32 + fVar107 * fVar34) * fVar45;
        auVar3._16_4_ = (fVar53 * fVar32 + fVar109 * fVar34) * fVar56;
        auVar3._20_4_ = (fVar61 * fVar32 + fVar111 * fVar34) * fVar62;
        auVar3._24_4_ = (fVar67 * fVar32 + fVar115 * fVar34) * fVar68;
        auVar3._28_4_ = fVar46 + fVar137;
        auVar17._4_4_ = fVar34;
        auVar17._0_4_ = fVar34;
        auVar17._8_4_ = fVar34;
        auVar17._12_4_ = fVar34;
        auVar17._16_4_ = fVar34;
        auVar17._20_4_ = fVar34;
        auVar17._24_4_ = fVar34;
        auVar17._28_4_ = fVar34;
        auVar3 = vblendvps_avx(auVar3,auVar17,auVar22);
        auVar14._4_4_ = fVar54;
        auVar14._0_4_ = fVar54;
        auVar14._8_4_ = fVar54;
        auVar14._12_4_ = fVar54;
        auVar14._16_4_ = fVar54;
        auVar14._20_4_ = fVar54;
        auVar14._24_4_ = fVar54;
        auVar14._28_4_ = fVar54;
        auVar4 = vblendvps_avx(auVar4,auVar14,auVar22);
        auVar5._4_4_ = (fVar86 * fVar52 + fVar23 * fVar55) * fVar25;
        auVar5._0_4_ = (fVar81 * fVar52 + fVar47 * fVar55) * fVar124;
        auVar5._8_4_ = (fVar116 * fVar52 + fVar28 * fVar55) * fVar33;
        auVar5._12_4_ = (fVar133 * fVar52 + fVar42 * fVar55) * fVar48;
        auVar5._16_4_ = (fVar134 * fVar52 + fVar53 * fVar55) * fVar58;
        auVar5._20_4_ = (fVar135 * fVar52 + fVar61 * fVar55) * fVar63;
        auVar5._24_4_ = (fVar136 * fVar52 + fVar67 * fVar55) * fVar69;
        auVar5._28_4_ = auVar35._28_4_;
        auVar13._4_4_ = fVar55;
        auVar13._0_4_ = fVar55;
        auVar13._8_4_ = fVar55;
        auVar13._12_4_ = fVar55;
        auVar13._16_4_ = fVar55;
        auVar13._20_4_ = fVar55;
        auVar13._24_4_ = fVar55;
        auVar13._28_4_ = fVar55;
        auVar5 = vblendvps_avx(auVar5,auVar13,auVar22);
        auVar12._4_4_ = (fVar23 * fVar112 + fVar86 * fVar27) * fVar25;
        auVar12._0_4_ = (fVar47 * fVar112 + fVar81 * fVar27) * fVar124;
        auVar12._8_4_ = (fVar28 * fVar112 + fVar116 * fVar27) * fVar33;
        auVar12._12_4_ = (fVar42 * fVar112 + fVar133 * fVar27) * fVar48;
        auVar12._16_4_ = (fVar53 * fVar112 + fVar134 * fVar27) * fVar58;
        auVar12._20_4_ = (fVar61 * fVar112 + fVar135 * fVar27) * fVar63;
        auVar12._24_4_ = (fVar67 * fVar112 + fVar136 * fVar27) * fVar69;
        auVar12._28_4_ = auVar74._28_4_ + auVar35._28_4_;
        auVar74 = vblendvps_avx(auVar12,auVar139,auVar22);
        auVar35 = vblendvps_avx(auVar6,auVar75,auVar22);
        auVar6 = vblendvps_avx(auVar10,auVar141,auVar22);
        auVar22 = vblendvps_avx(auVar11,auVar65,auVar22);
        fVar70 = fVar47 * fVar47 * fVar47;
        fVar72 = fVar23 * fVar23 * fVar23;
        fVar137 = fVar28 * fVar28 * fVar28;
        fVar73 = fVar42 * fVar42 * fVar42;
        fVar78 = fVar53 * fVar53 * fVar53;
        fVar79 = fVar61 * fVar61 * fVar61;
        fVar80 = fVar67 * fVar67 * fVar67;
        fVar125 = fVar81 * fVar81 * fVar81;
        fVar127 = fVar86 * fVar86 * fVar86;
        fVar128 = fVar116 * fVar116 * fVar116;
        fVar129 = fVar133 * fVar133 * fVar133;
        fVar130 = fVar134 * fVar134 * fVar134;
        fVar131 = fVar135 * fVar135 * fVar135;
        fVar132 = fVar136 * fVar136 * fVar136;
        fVar82 = fVar47 * fVar47 * fVar90 * 3.0;
        fVar83 = fVar23 * fVar23 * fVar93 * 3.0;
        fVar99 = fVar28 * fVar28 * fVar95 * 3.0;
        fVar84 = fVar42 * fVar42 * fVar97 * 3.0;
        fVar101 = fVar53 * fVar53 * fVar108 * 3.0;
        fVar85 = fVar61 * fVar61 * fVar110 * 3.0;
        fVar102 = fVar67 * fVar67 * fVar113 * 3.0;
        fVar103 = fVar81 * fVar91 * fVar81 * 3.0;
        fVar87 = fVar86 * fVar94 * fVar86 * 3.0;
        fVar104 = fVar116 * fVar96 * fVar116 * 3.0;
        fVar88 = fVar133 * fVar107 * fVar133 * 3.0;
        fVar105 = fVar134 * fVar109 * fVar134 * 3.0;
        fVar89 = fVar135 * fVar111 * fVar135 * 3.0;
        fVar106 = fVar136 * fVar115 * fVar136 * 3.0;
        fVar117 = fVar90 * fVar47 * fVar90 * 3.0;
        fVar118 = fVar93 * fVar23 * fVar93 * 3.0;
        fVar119 = fVar95 * fVar28 * fVar95 * 3.0;
        fVar120 = fVar97 * fVar42 * fVar97 * 3.0;
        fVar121 = fVar108 * fVar53 * fVar108 * 3.0;
        fVar122 = fVar110 * fVar61 * fVar110 * 3.0;
        fVar123 = fVar113 * fVar67 * fVar113 * 3.0;
        fVar61 = fVar91 * fVar91 * fVar81 * 3.0;
        fVar62 = fVar94 * fVar94 * fVar86 * 3.0;
        fVar63 = fVar96 * fVar96 * fVar116 * 3.0;
        fVar64 = fVar107 * fVar107 * fVar133 * 3.0;
        fVar67 = fVar109 * fVar109 * fVar134 * 3.0;
        fVar68 = fVar111 * fVar111 * fVar135 * 3.0;
        fVar69 = fVar115 * fVar115 * fVar136 * 3.0;
        fVar90 = fVar90 * fVar90 * fVar90;
        fVar93 = fVar93 * fVar93 * fVar93;
        fVar95 = fVar95 * fVar95 * fVar95;
        fVar97 = fVar97 * fVar97 * fVar97;
        fVar108 = fVar108 * fVar108 * fVar108;
        fVar110 = fVar110 * fVar110 * fVar110;
        fVar113 = fVar113 * fVar113 * fVar113;
        fVar91 = fVar91 * fVar91 * fVar91;
        fVar94 = fVar94 * fVar94 * fVar94;
        fVar96 = fVar96 * fVar96 * fVar96;
        fVar107 = fVar107 * fVar107 * fVar107;
        fVar109 = fVar109 * fVar109 * fVar109;
        fVar111 = fVar111 * fVar111 * fVar111;
        fVar115 = fVar115 * fVar115 * fVar115;
        fVar32 = patch->patch_v[0][2].field_0.m128[0];
        fVar34 = patch->patch_v[0][3].field_0.m128[0];
        fVar40 = patch->patch_v[0][1].field_0.m128[0];
        fVar43 = patch->patch_v[0][0].field_0.m128[0];
        fVar46 = patch->patch_v[1][3].field_0.m128[0];
        local_208._0_4_ = auVar9._0_4_;
        local_208._4_4_ = auVar9._4_4_;
        fStack_200 = auVar9._8_4_;
        fStack_1fc = auVar9._12_4_;
        fStack_1f8 = auVar9._16_4_;
        fStack_1f4 = auVar9._20_4_;
        fStack_1f0 = auVar9._24_4_;
        fVar49 = patch->patch_v[1][0].field_0.m128[0];
        fVar52 = patch->patch_v[2][3].field_0.m128[0];
        fVar54 = patch->patch_v[2][0].field_0.m128[0];
        fVar55 = patch->patch_v[3][3].field_0.m128[0];
        fVar27 = patch->patch_v[3][2].field_0.m128[0];
        fVar112 = patch->patch_v[3][1].field_0.m128[0];
        fVar29 = patch->patch_v[3][0].field_0.m128[0];
        fVar116 = fVar54 + auVar35._28_4_ + auVar4._28_4_ + fVar52 +
                  fVar29 + fVar112 + fVar27 + fVar55;
        fVar81 = fVar116 + fVar49 + auVar38._28_4_ + fVar46 + fVar34 + fVar34 + fVar32;
        fVar114 = patch->patch_v[0][3].field_0.m128[1];
        fVar31 = patch->patch_v[0][2].field_0.m128[1];
        fVar138 = patch->patch_v[0][1].field_0.m128[1];
        fVar41 = patch->patch_v[0][0].field_0.m128[1];
        fVar47 = patch->patch_v[1][3].field_0.m128[1];
        local_1e8._0_4_ = auVar7._0_4_;
        local_1e8._4_4_ = auVar7._4_4_;
        fStack_1e0 = auVar7._8_4_;
        fStack_1dc = auVar7._12_4_;
        fStack_1d8 = auVar7._16_4_;
        fStack_1d4 = auVar7._20_4_;
        fStack_1d0 = auVar7._24_4_;
        local_1c8._0_4_ = auVar1._0_4_;
        local_1c8._4_4_ = auVar1._4_4_;
        fStack_1c0 = auVar1._8_4_;
        fStack_1bc = auVar1._12_4_;
        fStack_1b8 = auVar1._16_4_;
        fStack_1b4 = auVar1._20_4_;
        fStack_1b0 = auVar1._24_4_;
        fVar50 = patch->patch_v[1][0].field_0.m128[1];
        fVar124 = patch->patch_v[2][3].field_0.m128[1];
        fVar19 = patch->patch_v[2][0].field_0.m128[1];
        fVar23 = patch->patch_v[3][2].field_0.m128[1];
        fVar24 = patch->patch_v[3][3].field_0.m128[1];
        fVar25 = patch->patch_v[3][1].field_0.m128[1];
        fVar26 = patch->patch_v[3][0].field_0.m128[1];
        fVar86 = fVar24 + fVar24 + fVar24 + fVar23;
        fVar28 = patch->patch_v[0][2].field_0.m128[2];
        fVar30 = patch->patch_v[0][3].field_0.m128[2];
        fVar33 = patch->patch_v[0][1].field_0.m128[2];
        fVar39 = patch->patch_v[0][0].field_0.m128[2];
        fVar42 = patch->patch_v[1][3].field_0.m128[2];
        local_1a8._0_4_ = auVar3._0_4_;
        local_1a8._4_4_ = auVar3._4_4_;
        fStack_1a0 = auVar3._8_4_;
        fStack_19c = auVar3._12_4_;
        fStack_198 = auVar3._16_4_;
        fStack_194 = auVar3._20_4_;
        fStack_190 = auVar3._24_4_;
        local_188._0_4_ = auVar8._0_4_;
        local_188._4_4_ = auVar8._4_4_;
        fStack_180 = auVar8._8_4_;
        fStack_17c = auVar8._12_4_;
        fStack_178 = auVar8._16_4_;
        fStack_174 = auVar8._20_4_;
        fStack_170 = auVar8._24_4_;
        fVar45 = patch->patch_v[1][0].field_0.m128[2];
        fVar48 = patch->patch_v[2][3].field_0.m128[2];
        local_148._0_4_ = auVar74._0_4_;
        local_148._4_4_ = auVar74._4_4_;
        fStack_140 = auVar74._8_4_;
        fStack_13c = auVar74._12_4_;
        fStack_138 = auVar74._16_4_;
        fStack_134 = auVar74._20_4_;
        fStack_130 = auVar74._24_4_;
        fVar51 = patch->patch_v[2][0].field_0.m128[2];
        local_168._0_4_ = auVar22._0_4_;
        local_168._4_4_ = auVar22._4_4_;
        fStack_160 = auVar22._8_4_;
        fStack_15c = auVar22._12_4_;
        fStack_158 = auVar22._16_4_;
        fStack_154 = auVar22._20_4_;
        fStack_150 = auVar22._24_4_;
        fVar53 = patch->patch_v[3][3].field_0.m128[2];
        fVar56 = patch->patch_v[3][2].field_0.m128[2];
        fVar58 = patch->patch_v[3][1].field_0.m128[2];
        fVar59 = patch->patch_v[3][0].field_0.m128[2];
        fVar71 = fVar71 + fVar98 + fVar60 + fVar44;
        *(float *)&in_RDI->field_0 =
             fVar125 * (fVar43 * fVar70 + fVar40 * fVar82 + fVar90 * fVar34 + fVar117 * fVar32) +
             (fVar54 * fVar70 + auVar35._0_4_ * fVar82 + fVar117 * auVar4._0_4_ + fVar90 * fVar52) *
             fVar61 + (fVar29 * fVar70 + fVar112 * fVar82 + fVar117 * fVar27 + fVar90 * fVar55) *
                      fVar91 +
             fVar103 * (fVar49 * fVar70 +
                       auVar38._0_4_ * fVar82 + fVar117 * (float)local_208._0_4_ + fVar90 * fVar46);
        *(float *)((long)&in_RDI->field_0 + 4) =
             fVar127 * (fVar43 * fVar72 + fVar40 * fVar83 + fVar93 * fVar34 + fVar118 * fVar32) +
             (fVar54 * fVar72 + auVar35._4_4_ * fVar83 + fVar118 * auVar4._4_4_ + fVar93 * fVar52) *
             fVar62 + (fVar29 * fVar72 + fVar112 * fVar83 + fVar118 * fVar27 + fVar93 * fVar55) *
                      fVar94 +
             fVar87 * (fVar49 * fVar72 +
                      auVar38._4_4_ * fVar83 + fVar118 * (float)local_208._4_4_ + fVar93 * fVar46);
        *(float *)((long)&in_RDI->field_0 + 8) =
             fVar128 * (fVar43 * fVar137 + fVar40 * fVar99 + fVar95 * fVar34 + fVar119 * fVar32) +
             (fVar54 * fVar137 + auVar35._8_4_ * fVar99 + fVar119 * auVar4._8_4_ + fVar95 * fVar52)
             * fVar63 +
             (fVar29 * fVar137 + fVar112 * fVar99 + fVar119 * fVar27 + fVar95 * fVar55) * fVar96 +
             fVar104 * (fVar49 * fVar137 +
                       auVar38._8_4_ * fVar99 + fVar119 * fStack_200 + fVar95 * fVar46);
        *(float *)((long)&in_RDI->field_0 + 0xc) =
             fVar129 * (fVar43 * fVar73 + fVar40 * fVar84 + fVar97 * fVar34 + fVar120 * fVar32) +
             (fVar54 * fVar73 + auVar35._12_4_ * fVar84 + fVar120 * auVar4._12_4_ + fVar97 * fVar52)
             * fVar64 +
             (fVar29 * fVar73 + fVar112 * fVar84 + fVar120 * fVar27 + fVar97 * fVar55) * fVar107 +
             fVar88 * (fVar49 * fVar73 +
                      auVar38._12_4_ * fVar84 + fVar120 * fStack_1fc + fVar97 * fVar46);
        *(float *)((long)&in_RDI->field_0 + 0x10) =
             fVar130 * (fVar43 * fVar78 + fVar40 * fVar101 + fVar108 * fVar34 + fVar121 * fVar32) +
             (fVar54 * fVar78 +
             auVar35._16_4_ * fVar101 + fVar121 * auVar4._16_4_ + fVar108 * fVar52) * fVar67 +
             (fVar29 * fVar78 + fVar112 * fVar101 + fVar121 * fVar27 + fVar108 * fVar55) * fVar109 +
             fVar105 * (fVar49 * fVar78 +
                       auVar38._16_4_ * fVar101 + fVar121 * fStack_1f8 + fVar108 * fVar46);
        *(float *)((long)&in_RDI->field_0 + 0x14) =
             fVar131 * (fVar43 * fVar79 + fVar40 * fVar85 + fVar110 * fVar34 + fVar122 * fVar32) +
             (fVar54 * fVar79 + auVar35._20_4_ * fVar85 + fVar122 * auVar4._20_4_ + fVar110 * fVar52
             ) * fVar68 +
             (fVar29 * fVar79 + fVar112 * fVar85 + fVar122 * fVar27 + fVar110 * fVar55) * fVar111 +
             fVar89 * (fVar49 * fVar79 +
                      auVar38._20_4_ * fVar85 + fVar122 * fStack_1f4 + fVar110 * fVar46);
        *(float *)((long)&in_RDI->field_0 + 0x18) =
             fVar132 * (fVar43 * fVar80 + fVar40 * fVar102 + fVar113 * fVar34 + fVar123 * fVar32) +
             (fVar54 * fVar80 +
             auVar35._24_4_ * fVar102 + fVar123 * auVar4._24_4_ + fVar113 * fVar52) * fVar69 +
             (fVar29 * fVar80 + fVar112 * fVar102 + fVar123 * fVar27 + fVar113 * fVar55) * fVar115 +
             fVar106 * (fVar49 * fVar80 +
                       auVar38._24_4_ * fVar102 + fVar123 * fStack_1f0 + fVar113 * fVar46);
        *(float *)((long)&in_RDI->field_0 + 0x1c) = fVar116 + fVar81;
        *(float *)((long)&in_RDI->field_0 + 0x20) =
             fVar125 * (fVar41 * fVar70 + fVar138 * fVar82 + fVar117 * fVar31 + fVar90 * fVar114) +
             (fVar50 * fVar70 +
             fVar82 * (float)local_1c8._0_4_ + fVar117 * (float)local_1e8._0_4_ + fVar90 * fVar47) *
             fVar103 + fVar61 * (fVar70 * fVar19 +
                                fVar82 * auVar6._0_4_ + fVar90 * fVar124 + fVar117 * auVar5._0_4_) +
                       fVar91 * (fVar26 * fVar70 +
                                fVar25 * fVar82 + fVar90 * fVar24 + fVar117 * fVar23);
        *(float *)((long)&in_RDI->field_0 + 0x24) =
             fVar127 * (fVar41 * fVar72 + fVar138 * fVar83 + fVar118 * fVar31 + fVar93 * fVar114) +
             (fVar50 * fVar72 +
             fVar83 * (float)local_1c8._4_4_ + fVar118 * (float)local_1e8._4_4_ + fVar93 * fVar47) *
             fVar87 + fVar62 * (fVar72 * fVar19 +
                               fVar83 * auVar6._4_4_ + fVar93 * fVar124 + fVar118 * auVar5._4_4_) +
                      fVar94 * (fVar26 * fVar72 +
                               fVar25 * fVar83 + fVar93 * fVar24 + fVar118 * fVar23);
        *(float *)((long)&in_RDI->field_0 + 0x28) =
             fVar128 * (fVar41 * fVar137 + fVar138 * fVar99 + fVar119 * fVar31 + fVar95 * fVar114) +
             (fVar50 * fVar137 + fVar99 * fStack_1c0 + fVar119 * fStack_1e0 + fVar95 * fVar47) *
             fVar104 + fVar63 * (fVar137 * fVar19 +
                                fVar99 * auVar6._8_4_ + fVar95 * fVar124 + fVar119 * auVar5._8_4_) +
                       fVar96 * (fVar26 * fVar137 +
                                fVar25 * fVar99 + fVar95 * fVar24 + fVar119 * fVar23);
        *(float *)((long)&in_RDI->field_0 + 0x2c) =
             fVar129 * (fVar41 * fVar73 + fVar138 * fVar84 + fVar120 * fVar31 + fVar97 * fVar114) +
             (fVar50 * fVar73 + fVar84 * fStack_1bc + fVar120 * fStack_1dc + fVar97 * fVar47) *
             fVar88 + fVar64 * (fVar73 * fVar19 +
                               fVar84 * auVar6._12_4_ + fVar97 * fVar124 + fVar120 * auVar5._12_4_)
                      + fVar107 * (fVar26 * fVar73 +
                                  fVar25 * fVar84 + fVar97 * fVar24 + fVar120 * fVar23);
        *(float *)((long)&in_RDI->field_0 + 0x30) =
             fVar130 * (fVar41 * fVar78 + fVar138 * fVar101 + fVar121 * fVar31 + fVar108 * fVar114)
             + (fVar50 * fVar78 + fVar101 * fStack_1b8 + fVar121 * fStack_1d8 + fVar108 * fVar47) *
               fVar105 + fVar67 * (fVar78 * fVar19 +
                                  fVar101 * auVar6._16_4_ +
                                  fVar108 * fVar124 + fVar121 * auVar5._16_4_) +
                         fVar109 * (fVar26 * fVar78 +
                                   fVar25 * fVar101 + fVar108 * fVar24 + fVar121 * fVar23);
        *(float *)((long)&in_RDI->field_0 + 0x34) =
             fVar131 * (fVar41 * fVar79 + fVar138 * fVar85 + fVar122 * fVar31 + fVar110 * fVar114) +
             (fVar50 * fVar79 + fVar85 * fStack_1b4 + fVar122 * fStack_1d4 + fVar110 * fVar47) *
             fVar89 + fVar68 * (fVar79 * fVar19 +
                               fVar85 * auVar6._20_4_ + fVar110 * fVar124 + fVar122 * auVar5._20_4_)
                      + fVar111 * (fVar26 * fVar79 +
                                  fVar25 * fVar85 + fVar110 * fVar24 + fVar122 * fVar23);
        *(float *)((long)&in_RDI->field_0 + 0x38) =
             fVar132 * (fVar41 * fVar80 + fVar138 * fVar102 + fVar123 * fVar31 + fVar113 * fVar114)
             + (fVar50 * fVar80 + fVar102 * fStack_1b0 + fVar123 * fStack_1d0 + fVar113 * fVar47) *
               fVar106 + fVar69 * (fVar80 * fVar19 +
                                  fVar102 * auVar6._24_4_ +
                                  fVar113 * fVar124 + fVar123 * auVar5._24_4_) +
                         fVar115 * (fVar26 * fVar80 +
                                   fVar25 * fVar102 + fVar113 * fVar24 + fVar123 * fVar23);
        *(float *)((long)&in_RDI->field_0 + 0x3c) =
             fVar41 + fVar138 + fVar31 + fVar81 +
             fVar86 + fVar19 + auVar6._28_4_ + fVar124 + auVar5._28_4_ + fVar86;
        *(float *)((long)&in_RDI->field_0 + 0x40) =
             fVar125 * (fVar70 * fVar39 + fVar82 * fVar33 + fVar117 * fVar28 + fVar90 * fVar30) +
             fVar103 * (fVar45 * fVar70 +
                       fVar82 * (float)local_188._0_4_ +
                       fVar117 * (float)local_1a8._0_4_ + fVar90 * fVar42) +
             (fVar51 * fVar70 +
             fVar82 * (float)local_168._0_4_ + fVar117 * (float)local_148._0_4_ + fVar90 * fVar48) *
             fVar61 + fVar91 * (fVar59 * fVar70 +
                               fVar117 * fVar56 + fVar90 * fVar53 + fVar58 * fVar82);
        *(float *)((long)&in_RDI->field_0 + 0x44) =
             fVar127 * (fVar72 * fVar39 + fVar83 * fVar33 + fVar118 * fVar28 + fVar93 * fVar30) +
             fVar87 * (fVar45 * fVar72 +
                      fVar83 * (float)local_188._4_4_ +
                      fVar118 * (float)local_1a8._4_4_ + fVar93 * fVar42) +
             (fVar51 * fVar72 +
             fVar83 * (float)local_168._4_4_ + fVar118 * (float)local_148._4_4_ + fVar93 * fVar48) *
             fVar62 + fVar94 * (fVar59 * fVar72 +
                               fVar118 * fVar56 + fVar93 * fVar53 + fVar58 * fVar83);
        *(float *)((long)&in_RDI->field_0 + 0x48) =
             fVar128 * (fVar137 * fVar39 + fVar99 * fVar33 + fVar119 * fVar28 + fVar95 * fVar30) +
             fVar104 * (fVar45 * fVar137 +
                       fVar99 * fStack_180 + fVar119 * fStack_1a0 + fVar95 * fVar42) +
             (fVar51 * fVar137 + fVar99 * fStack_160 + fVar119 * fStack_140 + fVar95 * fVar48) *
             fVar63 + fVar96 * (fVar59 * fVar137 +
                               fVar119 * fVar56 + fVar95 * fVar53 + fVar58 * fVar99);
        *(float *)((long)&in_RDI->field_0 + 0x4c) =
             fVar129 * (fVar73 * fVar39 + fVar84 * fVar33 + fVar120 * fVar28 + fVar97 * fVar30) +
             fVar88 * (fVar45 * fVar73 +
                      fVar84 * fStack_17c + fVar120 * fStack_19c + fVar97 * fVar42) +
             (fVar51 * fVar73 + fVar84 * fStack_15c + fVar120 * fStack_13c + fVar97 * fVar48) *
             fVar64 + fVar107 * (fVar59 * fVar73 +
                                fVar120 * fVar56 + fVar97 * fVar53 + fVar58 * fVar84);
        *(float *)((long)&in_RDI->field_0 + 0x50) =
             fVar130 * (fVar78 * fVar39 + fVar101 * fVar33 + fVar121 * fVar28 + fVar108 * fVar30) +
             fVar105 * (fVar45 * fVar78 +
                       fVar101 * fStack_178 + fVar121 * fStack_198 + fVar108 * fVar42) +
             (fVar51 * fVar78 + fVar101 * fStack_158 + fVar121 * fStack_138 + fVar108 * fVar48) *
             fVar67 + fVar109 * (fVar59 * fVar78 +
                                fVar121 * fVar56 + fVar108 * fVar53 + fVar58 * fVar101);
        *(float *)((long)&in_RDI->field_0 + 0x54) =
             fVar131 * (fVar79 * fVar39 + fVar85 * fVar33 + fVar122 * fVar28 + fVar110 * fVar30) +
             fVar89 * (fVar45 * fVar79 +
                      fVar85 * fStack_174 + fVar122 * fStack_194 + fVar110 * fVar42) +
             (fVar51 * fVar79 + fVar85 * fStack_154 + fVar122 * fStack_134 + fVar110 * fVar48) *
             fVar68 + fVar111 * (fVar59 * fVar79 +
                                fVar122 * fVar56 + fVar110 * fVar53 + fVar58 * fVar85);
        *(float *)((long)&in_RDI->field_0 + 0x58) =
             fVar132 * (fVar80 * fVar39 + fVar102 * fVar33 + fVar123 * fVar28 + fVar113 * fVar30) +
             fVar106 * (fVar45 * fVar80 +
                       fVar102 * fStack_170 + fVar123 * fStack_190 + fVar113 * fVar42) +
             (fVar51 * fVar80 + fVar102 * fStack_150 + fVar123 * fStack_130 + fVar113 * fVar48) *
             fVar69 + fVar115 * (fVar59 * fVar80 +
                                fVar123 * fVar56 + fVar113 * fVar53 + fVar58 * fVar102);
        *(float *)((long)&in_RDI->field_0 + 0x5c) = fVar71 + fVar71 + auVar22._28_4_ + fVar71;
        return in_RDI;
      }
      if (uVar2 != '\x06') {
        auVar20 = ZEXT816(0);
        (in_RDI->field_0).field_0.z.field_0 =
             (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar20);
        (in_RDI->field_0).field_0.y.field_0 =
             (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar20);
        *(undefined1 (*) [32])&in_RDI->field_0 = ZEXT1632(auVar20);
        return in_RDI;
      }
      fVar32 = patch->patch_v[0][0].field_0.m128[0];
      auVar20 = ZEXT416((uint)(patch->patch_v[0][1].field_0.m128[0] -
                              patch->patch_v[0][0].field_0.m128[0]));
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      fVar40 = (uu->field_0).v[0];
      fVar43 = (uu->field_0).v[1];
      fVar46 = (uu->field_0).v[2];
      fVar49 = (uu->field_0).v[3];
      fVar52 = (uu->field_0).v[4];
      fVar54 = (uu->field_0).v[5];
      fVar55 = (uu->field_0).v[6];
      fVar34 = patch->patch_v[0][3].field_0.m128[0];
      auVar57._0_4_ = fVar32 + fVar40 * auVar20._0_4_;
      auVar57._4_4_ = fVar32 + fVar43 * auVar20._4_4_;
      auVar57._8_4_ = fVar32 + fVar46 * auVar20._8_4_;
      auVar57._12_4_ = fVar32 + fVar49 * auVar20._12_4_;
      auVar57._16_4_ = fVar32 + fVar52 * auVar20._0_4_;
      auVar57._20_4_ = fVar32 + fVar54 * auVar20._4_4_;
      auVar57._24_4_ = fVar32 + fVar55 * auVar20._8_4_;
      auVar57._28_4_ = fVar32 + auVar20._12_4_;
      auVar20 = ZEXT416((uint)(patch->patch_v[0][2].field_0.m128[0] -
                              patch->patch_v[0][3].field_0.m128[0]));
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      auVar38._0_4_ = fVar34 + fVar40 * auVar20._0_4_;
      auVar38._4_4_ = fVar34 + fVar43 * auVar20._4_4_;
      auVar38._8_4_ = fVar34 + fVar46 * auVar20._8_4_;
      auVar38._12_4_ = fVar34 + fVar49 * auVar20._12_4_;
      auVar38._16_4_ = fVar34 + fVar52 * auVar20._0_4_;
      auVar38._20_4_ = fVar34 + fVar54 * auVar20._4_4_;
      auVar38._24_4_ = fVar34 + fVar55 * auVar20._8_4_;
      auVar38._28_4_ = fVar34 + auVar20._12_4_;
      auVar38 = vsubps_avx(auVar38,auVar57);
      fVar27 = (vv->field_0).v[0];
      fVar112 = (vv->field_0).v[1];
      fVar29 = (vv->field_0).v[2];
      fVar114 = (vv->field_0).v[3];
      fVar31 = (vv->field_0).v[4];
      fVar138 = (vv->field_0).v[5];
      fVar41 = (vv->field_0).v[6];
      fVar32 = patch->patch_v[0][0].field_0.m128[1];
      auVar20 = ZEXT416((uint)(patch->patch_v[0][1].field_0.m128[1] -
                              patch->patch_v[0][0].field_0.m128[1]));
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      fVar34 = patch->patch_v[0][3].field_0.m128[1];
      auVar66._0_4_ = fVar32 + fVar40 * auVar20._0_4_;
      auVar66._4_4_ = fVar32 + fVar43 * auVar20._4_4_;
      auVar66._8_4_ = fVar32 + fVar46 * auVar20._8_4_;
      auVar66._12_4_ = fVar32 + fVar49 * auVar20._12_4_;
      auVar66._16_4_ = fVar32 + fVar52 * auVar20._0_4_;
      auVar66._20_4_ = fVar32 + fVar54 * auVar20._4_4_;
      auVar66._24_4_ = fVar32 + fVar55 * auVar20._8_4_;
      auVar66._28_4_ = fVar32 + auVar20._12_4_;
      auVar20 = ZEXT416((uint)(patch->patch_v[0][2].field_0.m128[1] -
                              patch->patch_v[0][3].field_0.m128[1]));
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      auVar76._0_4_ = fVar34 + fVar40 * auVar20._0_4_;
      auVar76._4_4_ = fVar34 + fVar43 * auVar20._4_4_;
      auVar76._8_4_ = fVar34 + fVar46 * auVar20._8_4_;
      auVar76._12_4_ = fVar34 + fVar49 * auVar20._12_4_;
      auVar76._16_4_ = fVar34 + fVar52 * auVar20._0_4_;
      auVar76._20_4_ = fVar34 + fVar54 * auVar20._4_4_;
      auVar76._24_4_ = fVar34 + fVar55 * auVar20._8_4_;
      auVar76._28_4_ = fVar34 + auVar20._12_4_;
      auVar1 = vsubps_avx(auVar76,auVar66);
      fVar32 = patch->patch_v[0][0].field_0.m128[2];
      auVar20 = ZEXT416((uint)(patch->patch_v[0][1].field_0.m128[2] -
                              patch->patch_v[0][0].field_0.m128[2]));
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      auVar77._0_4_ = fVar32 + fVar40 * auVar20._0_4_;
      auVar77._4_4_ = fVar32 + fVar43 * auVar20._4_4_;
      auVar77._8_4_ = fVar32 + fVar46 * auVar20._8_4_;
      auVar77._12_4_ = fVar32 + fVar49 * auVar20._12_4_;
      auVar77._16_4_ = fVar32 + fVar52 * auVar20._0_4_;
      auVar77._20_4_ = fVar32 + fVar54 * auVar20._4_4_;
      auVar77._24_4_ = fVar32 + fVar55 * auVar20._8_4_;
      auVar77._28_4_ = fVar32 + auVar20._12_4_;
      fVar32 = patch->patch_v[0][3].field_0.m128[2];
      auVar20 = ZEXT416((uint)(patch->patch_v[0][2].field_0.m128[2] -
                              patch->patch_v[0][3].field_0.m128[2]));
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      auVar22._0_4_ = fVar32 + fVar40 * auVar20._0_4_;
      auVar22._4_4_ = fVar32 + fVar43 * auVar20._4_4_;
      auVar22._8_4_ = fVar32 + fVar46 * auVar20._8_4_;
      auVar22._12_4_ = fVar32 + fVar49 * auVar20._12_4_;
      auVar22._16_4_ = fVar32 + fVar52 * auVar20._0_4_;
      auVar22._20_4_ = fVar32 + fVar54 * auVar20._4_4_;
      auVar22._24_4_ = fVar32 + fVar55 * auVar20._8_4_;
      auVar22._28_4_ = fVar32 + (uu->field_0).v[7];
      auVar8 = vsubps_avx(auVar22,auVar77);
      fVar34 = auVar77._0_4_ + fVar27 * auVar8._0_4_;
      fVar40 = auVar77._4_4_ + fVar112 * auVar8._4_4_;
      fVar43 = auVar77._8_4_ + fVar29 * auVar8._8_4_;
      fVar46 = auVar77._12_4_ + fVar114 * auVar8._12_4_;
      fVar49 = auVar77._16_4_ + fVar31 * auVar8._16_4_;
      fVar52 = auVar77._20_4_ + fVar138 * auVar8._20_4_;
      fVar54 = auVar77._24_4_ + fVar41 * auVar8._24_4_;
      fVar32 = auVar77._28_4_ + auVar8._28_4_;
      *(float *)&in_RDI->field_0 = auVar57._0_4_ + fVar27 * auVar38._0_4_;
      *(float *)((long)&in_RDI->field_0 + 4) = auVar57._4_4_ + fVar112 * auVar38._4_4_;
      *(float *)((long)&in_RDI->field_0 + 8) = auVar57._8_4_ + fVar29 * auVar38._8_4_;
      *(float *)((long)&in_RDI->field_0 + 0xc) = auVar57._12_4_ + fVar114 * auVar38._12_4_;
      *(float *)((long)&in_RDI->field_0 + 0x10) = auVar57._16_4_ + fVar31 * auVar38._16_4_;
      *(float *)((long)&in_RDI->field_0 + 0x14) = auVar57._20_4_ + fVar138 * auVar38._20_4_;
      *(float *)((long)&in_RDI->field_0 + 0x18) = auVar57._24_4_ + fVar41 * auVar38._24_4_;
      *(float *)((long)&in_RDI->field_0 + 0x1c) = auVar57._28_4_ + auVar38._28_4_;
      *(float *)((long)&in_RDI->field_0 + 0x20) = auVar66._0_4_ + fVar27 * auVar1._0_4_;
      *(float *)((long)&in_RDI->field_0 + 0x24) = auVar66._4_4_ + fVar112 * auVar1._4_4_;
      *(float *)((long)&in_RDI->field_0 + 0x28) = auVar66._8_4_ + fVar29 * auVar1._8_4_;
      *(float *)((long)&in_RDI->field_0 + 0x2c) = auVar66._12_4_ + fVar114 * auVar1._12_4_;
      *(float *)((long)&in_RDI->field_0 + 0x30) = auVar66._16_4_ + fVar31 * auVar1._16_4_;
      *(float *)((long)&in_RDI->field_0 + 0x34) = auVar66._20_4_ + fVar138 * auVar1._20_4_;
      *(float *)((long)&in_RDI->field_0 + 0x38) = auVar66._24_4_ + fVar41 * auVar1._24_4_;
      *(float *)((long)&in_RDI->field_0 + 0x3c) = auVar66._28_4_ + auVar1._28_4_;
      goto LAB_0150b055;
    }
    auVar38 = *(undefined1 (*) [32])(uu->field_0).v;
    auVar100._8_4_ = 0x3f800000;
    auVar100._0_8_ = 0x3f8000003f800000;
    auVar100._12_4_ = 0x3f800000;
    auVar100._16_4_ = 0x3f800000;
    auVar100._20_4_ = 0x3f800000;
    auVar100._24_4_ = 0x3f800000;
    auVar100._28_4_ = 0x3f800000;
    auVar1 = vsubps_avx(auVar100,auVar38);
    fVar32 = auVar1._0_4_;
    fVar40 = auVar1._4_4_;
    fVar46 = auVar1._8_4_;
    fVar52 = auVar1._12_4_;
    fVar55 = auVar1._16_4_;
    fVar112 = auVar1._20_4_;
    fVar114 = auVar1._24_4_;
    fVar58 = fVar32 * fVar32 * fVar32;
    fVar59 = fVar40 * fVar40 * fVar40;
    fVar60 = fVar46 * fVar46 * fVar46;
    fVar61 = fVar52 * fVar52 * fVar52;
    fVar62 = fVar55 * fVar55 * fVar55;
    fVar63 = fVar112 * fVar112 * fVar112;
    fVar64 = fVar114 * fVar114 * fVar114;
    fVar34 = auVar38._0_4_;
    fVar43 = auVar38._4_4_;
    fVar49 = auVar38._8_4_;
    fVar54 = auVar38._12_4_;
    fVar27 = auVar38._16_4_;
    fVar29 = auVar38._20_4_;
    fVar31 = auVar38._24_4_;
    fVar67 = fVar34 * fVar34 * fVar34;
    fVar68 = fVar43 * fVar43 * fVar43;
    fVar69 = fVar49 * fVar49 * fVar49;
    fVar70 = fVar54 * fVar54 * fVar54;
    fVar71 = fVar27 * fVar27 * fVar27;
    fVar72 = fVar29 * fVar29 * fVar29;
    fVar137 = fVar31 * fVar31 * fVar31;
    fVar138 = fVar32 * fVar34 * fVar32;
    fVar41 = fVar40 * fVar43 * fVar40;
    fVar44 = fVar46 * fVar49 * fVar46;
    fVar47 = fVar52 * fVar54 * fVar52;
    fVar50 = fVar55 * fVar27 * fVar55;
    fVar124 = fVar112 * fVar29 * fVar112;
    fVar53 = fVar114 * fVar31 * fVar114;
    fVar34 = fVar34 * fVar34 * fVar32;
    fVar43 = fVar43 * fVar43 * fVar40;
    fVar49 = fVar49 * fVar49 * fVar46;
    fVar54 = fVar54 * fVar54 * fVar52;
    fVar27 = fVar27 * fVar27 * fVar55;
    fVar29 = fVar29 * fVar29 * fVar112;
    fVar31 = fVar31 * fVar31 * fVar114;
    fVar32 = auVar38._28_4_ + auVar1._28_4_;
    fVar19 = fVar58 * 0.16666667;
    fVar23 = fVar59 * 0.16666667;
    fVar24 = fVar60 * 0.16666667;
    fVar25 = fVar61 * 0.16666667;
    fVar26 = fVar62 * 0.16666667;
    fVar28 = fVar63 * 0.16666667;
    fVar30 = fVar64 * 0.16666667;
    fVar33 = (fVar138 * 12.0 + fVar34 * 6.0 + fVar67 + fVar58 * 4.0) * 0.16666667;
    fVar39 = (fVar41 * 12.0 + fVar43 * 6.0 + fVar68 + fVar59 * 4.0) * 0.16666667;
    fVar42 = (fVar44 * 12.0 + fVar49 * 6.0 + fVar69 + fVar60 * 4.0) * 0.16666667;
    fVar45 = (fVar47 * 12.0 + fVar54 * 6.0 + fVar70 + fVar61 * 4.0) * 0.16666667;
    fVar48 = (fVar50 * 12.0 + fVar27 * 6.0 + fVar71 + fVar62 * 4.0) * 0.16666667;
    fVar51 = (fVar124 * 12.0 + fVar29 * 6.0 + fVar72 + fVar63 * 4.0) * 0.16666667;
    fVar56 = (fVar53 * 12.0 + fVar31 * 6.0 + fVar137 + fVar64 * 4.0) * 0.16666667;
    fVar58 = (fVar67 * 4.0 + fVar58 + fVar34 * 12.0 + fVar138 * 6.0) * 0.16666667;
    fVar59 = (fVar68 * 4.0 + fVar59 + fVar43 * 12.0 + fVar41 * 6.0) * 0.16666667;
    fVar60 = (fVar69 * 4.0 + fVar60 + fVar49 * 12.0 + fVar44 * 6.0) * 0.16666667;
    fVar61 = (fVar70 * 4.0 + fVar61 + fVar54 * 12.0 + fVar47 * 6.0) * 0.16666667;
    fVar62 = (fVar71 * 4.0 + fVar62 + fVar27 * 12.0 + fVar50 * 6.0) * 0.16666667;
    fVar63 = (fVar72 * 4.0 + fVar63 + fVar29 * 12.0 + fVar124 * 6.0) * 0.16666667;
    fVar53 = (fVar137 * 4.0 + fVar64 + fVar31 * 12.0 + fVar53 * 6.0) * 0.16666667;
    fVar67 = fVar67 * 0.16666667;
    fVar68 = fVar68 * 0.16666667;
    fVar69 = fVar69 * 0.16666667;
    fVar70 = fVar70 * 0.16666667;
    fVar71 = fVar71 * 0.16666667;
    fVar72 = fVar72 * 0.16666667;
    fVar137 = fVar137 * 0.16666667;
    auVar38 = *(undefined1 (*) [32])(vv->field_0).v;
    auVar8 = vsubps_avx(auVar100,auVar38);
    fVar34 = auVar8._0_4_;
    fVar43 = auVar8._4_4_;
    fVar49 = auVar8._8_4_;
    fVar54 = auVar8._12_4_;
    fVar27 = auVar8._16_4_;
    fVar29 = auVar8._20_4_;
    fVar31 = auVar8._24_4_;
    fVar103 = fVar34 * fVar34 * fVar34;
    fVar87 = fVar43 * fVar43 * fVar43;
    fVar104 = fVar49 * fVar49 * fVar49;
    fVar88 = fVar54 * fVar54 * fVar54;
    fVar105 = fVar27 * fVar27 * fVar27;
    fVar107 = fVar29 * fVar29 * fVar29;
    fVar108 = fVar31 * fVar31 * fVar31;
    fVar40 = auVar38._0_4_;
    fVar46 = auVar38._4_4_;
    fVar52 = auVar38._8_4_;
    fVar55 = auVar38._12_4_;
    fVar112 = auVar38._16_4_;
    fVar114 = auVar38._20_4_;
    fVar138 = auVar38._24_4_;
    fVar90 = fVar40 * fVar40 * fVar40;
    fVar91 = fVar46 * fVar46 * fVar46;
    fVar93 = fVar52 * fVar52 * fVar52;
    fVar94 = fVar55 * fVar55 * fVar55;
    fVar95 = fVar112 * fVar112 * fVar112;
    fVar96 = fVar114 * fVar114 * fVar114;
    fVar97 = fVar138 * fVar138 * fVar138;
    fVar41 = fVar40 * fVar34 * fVar34;
    fVar44 = fVar46 * fVar43 * fVar43;
    fVar47 = fVar52 * fVar49 * fVar49;
    fVar50 = fVar55 * fVar54 * fVar54;
    fVar124 = fVar112 * fVar27 * fVar27;
    fVar89 = fVar114 * fVar29 * fVar29;
    fVar106 = fVar138 * fVar31 * fVar31;
    fVar40 = fVar40 * fVar40 * fVar34;
    fVar46 = fVar46 * fVar46 * fVar43;
    fVar52 = fVar52 * fVar52 * fVar49;
    fVar55 = fVar55 * fVar55 * fVar54;
    fVar112 = fVar112 * fVar112 * fVar27;
    fVar114 = fVar114 * fVar114 * fVar29;
    fVar138 = fVar138 * fVar138 * fVar31;
    fVar64 = fVar103 * 0.16666667;
    fVar73 = fVar87 * 0.16666667;
    fVar78 = fVar104 * 0.16666667;
    fVar79 = fVar88 * 0.16666667;
    fVar80 = fVar105 * 0.16666667;
    fVar81 = fVar107 * 0.16666667;
    fVar82 = fVar108 * 0.16666667;
    fVar83 = (fVar90 + fVar103 * 4.0 + fVar41 * 12.0 + fVar40 * 6.0) * 0.16666667;
    fVar99 = (fVar91 + fVar87 * 4.0 + fVar44 * 12.0 + fVar46 * 6.0) * 0.16666667;
    fVar84 = (fVar93 + fVar104 * 4.0 + fVar47 * 12.0 + fVar52 * 6.0) * 0.16666667;
    fVar101 = (fVar94 + fVar88 * 4.0 + fVar50 * 12.0 + fVar55 * 6.0) * 0.16666667;
    fVar85 = (fVar95 + fVar105 * 4.0 + fVar124 * 12.0 + fVar112 * 6.0) * 0.16666667;
    fVar102 = (fVar96 + fVar107 * 4.0 + fVar89 * 12.0 + fVar114 * 6.0) * 0.16666667;
    fVar86 = (fVar97 + fVar108 * 4.0 + fVar106 * 12.0 + fVar138 * 6.0) * 0.16666667;
    fVar103 = (fVar103 + fVar90 * 4.0 + fVar40 * 12.0 + fVar41 * 6.0) * 0.16666667;
    fVar87 = (fVar87 + fVar91 * 4.0 + fVar46 * 12.0 + fVar44 * 6.0) * 0.16666667;
    fVar104 = (fVar104 + fVar93 * 4.0 + fVar52 * 12.0 + fVar47 * 6.0) * 0.16666667;
    fVar88 = (fVar88 + fVar94 * 4.0 + fVar55 * 12.0 + fVar50 * 6.0) * 0.16666667;
    fVar105 = (fVar105 + fVar95 * 4.0 + fVar112 * 12.0 + fVar124 * 6.0) * 0.16666667;
    fVar89 = (fVar107 + fVar96 * 4.0 + fVar114 * 12.0 + fVar89 * 6.0) * 0.16666667;
    fVar106 = (fVar108 + fVar97 * 4.0 + fVar138 * 12.0 + fVar106 * 6.0) * 0.16666667;
    fVar90 = fVar90 * 0.16666667;
    fVar91 = fVar91 * 0.16666667;
    fVar93 = fVar93 * 0.16666667;
    fVar94 = fVar94 * 0.16666667;
    fVar95 = fVar95 * 0.16666667;
    fVar96 = fVar96 * 0.16666667;
    fVar97 = fVar97 * 0.16666667;
    fVar34 = patch->patch_v[0][0].field_0.m128[0];
    fVar40 = patch->patch_v[1][0].field_0.m128[0];
    fVar43 = patch->patch_v[2][0].field_0.m128[0];
    fVar46 = patch->patch_v[3][0].field_0.m128[0];
    fVar49 = patch->patch_v[0][1].field_0.m128[0];
    fVar52 = patch->patch_v[1][1].field_0.m128[0];
    fVar54 = patch->patch_v[2][1].field_0.m128[0];
    fVar55 = patch->patch_v[3][1].field_0.m128[0];
    fVar27 = patch->patch_v[0][2].field_0.m128[0];
    fVar112 = patch->patch_v[1][2].field_0.m128[0];
    fVar29 = patch->patch_v[2][2].field_0.m128[0];
    fVar114 = patch->patch_v[3][2].field_0.m128[0];
    fVar116 = fVar112 + fVar29 + fVar114;
    fVar31 = patch->patch_v[0][3].field_0.m128[0];
    fVar138 = patch->patch_v[1][3].field_0.m128[0];
    fVar41 = patch->patch_v[2][3].field_0.m128[0];
    fVar44 = patch->patch_v[3][3].field_0.m128[0];
    fVar47 = patch->patch_v[0][0].field_0.m128[1];
    fVar50 = patch->patch_v[1][0].field_0.m128[1];
    fVar124 = patch->patch_v[2][0].field_0.m128[1];
    fVar107 = (fVar34 * fVar64 + fVar40 * fVar83 + fVar43 * fVar103 + fVar46 * fVar90) * fVar19 +
              (fVar49 * fVar64 + fVar52 * fVar83 + fVar54 * fVar103 + fVar55 * fVar90) * fVar33 +
              (fVar27 * fVar64 + fVar112 * fVar83 + fVar29 * fVar103 + fVar114 * fVar90) * fVar58 +
              (fVar31 * fVar64 + fVar138 * fVar83 + fVar41 * fVar103 + fVar44 * fVar90) * fVar67;
    fVar108 = (fVar34 * fVar73 + fVar40 * fVar99 + fVar43 * fVar87 + fVar46 * fVar91) * fVar23 +
              (fVar49 * fVar73 + fVar52 * fVar99 + fVar54 * fVar87 + fVar55 * fVar91) * fVar39 +
              (fVar27 * fVar73 + fVar112 * fVar99 + fVar29 * fVar87 + fVar114 * fVar91) * fVar59 +
              (fVar31 * fVar73 + fVar138 * fVar99 + fVar41 * fVar87 + fVar44 * fVar91) * fVar68;
    fVar109 = (fVar34 * fVar78 + fVar40 * fVar84 + fVar43 * fVar104 + fVar46 * fVar93) * fVar24 +
              (fVar49 * fVar78 + fVar52 * fVar84 + fVar54 * fVar104 + fVar55 * fVar93) * fVar42 +
              (fVar27 * fVar78 + fVar112 * fVar84 + fVar29 * fVar104 + fVar114 * fVar93) * fVar60 +
              (fVar31 * fVar78 + fVar138 * fVar84 + fVar41 * fVar104 + fVar44 * fVar93) * fVar69;
    fVar110 = (fVar34 * fVar79 + fVar40 * fVar101 + fVar43 * fVar88 + fVar46 * fVar94) * fVar25 +
              (fVar49 * fVar79 + fVar52 * fVar101 + fVar54 * fVar88 + fVar55 * fVar94) * fVar45 +
              (fVar27 * fVar79 + fVar112 * fVar101 + fVar29 * fVar88 + fVar114 * fVar94) * fVar61 +
              (fVar31 * fVar79 + fVar138 * fVar101 + fVar41 * fVar88 + fVar44 * fVar94) * fVar70;
    fVar111 = (fVar34 * fVar80 + fVar40 * fVar85 + fVar43 * fVar105 + fVar46 * fVar95) * fVar26 +
              (fVar49 * fVar80 + fVar52 * fVar85 + fVar54 * fVar105 + fVar55 * fVar95) * fVar48 +
              (fVar27 * fVar80 + fVar112 * fVar85 + fVar29 * fVar105 + fVar114 * fVar95) * fVar62 +
              (fVar31 * fVar80 + fVar138 * fVar85 + fVar41 * fVar105 + fVar44 * fVar95) * fVar71;
    fVar113 = (fVar34 * fVar81 + fVar40 * fVar102 + fVar43 * fVar89 + fVar46 * fVar96) * fVar28 +
              (fVar49 * fVar81 + fVar52 * fVar102 + fVar54 * fVar89 + fVar55 * fVar96) * fVar51 +
              (fVar27 * fVar81 + fVar112 * fVar102 + fVar29 * fVar89 + fVar114 * fVar96) * fVar63 +
              (fVar31 * fVar81 + fVar138 * fVar102 + fVar41 * fVar89 + fVar44 * fVar96) * fVar72;
    fVar115 = (fVar34 * fVar82 + fVar40 * fVar86 + fVar43 * fVar106 + fVar46 * fVar97) * fVar30 +
              (fVar49 * fVar82 + fVar52 * fVar86 + fVar54 * fVar106 + fVar55 * fVar97) * fVar56 +
              (fVar27 * fVar82 + fVar112 * fVar86 + fVar29 * fVar106 + fVar114 * fVar97) * fVar53 +
              (fVar31 * fVar82 + fVar138 * fVar86 + fVar41 * fVar106 + fVar44 * fVar97) * fVar137;
    fVar116 = fVar34 + fVar40 + fVar43 + fVar46 +
              fVar49 + fVar52 + fVar54 + fVar55 +
              fVar27 + fVar116 + fVar31 + fVar138 + fVar41 + fVar116;
    fVar34 = patch->patch_v[3][0].field_0.m128[1];
    fVar40 = patch->patch_v[0][1].field_0.m128[1];
    fVar43 = patch->patch_v[1][1].field_0.m128[1];
    fVar46 = patch->patch_v[2][1].field_0.m128[1];
    fVar49 = patch->patch_v[3][1].field_0.m128[1];
    fVar138 = fVar43 + fVar46 + fVar49;
    fVar52 = patch->patch_v[0][2].field_0.m128[1];
    fVar54 = patch->patch_v[1][2].field_0.m128[1];
    fVar55 = patch->patch_v[2][2].field_0.m128[1];
    fVar27 = patch->patch_v[3][2].field_0.m128[1];
    fVar112 = patch->patch_v[0][3].field_0.m128[1];
    fVar29 = patch->patch_v[1][3].field_0.m128[1];
    fVar114 = patch->patch_v[2][3].field_0.m128[1];
    fVar31 = patch->patch_v[3][3].field_0.m128[1];
    fVar117 = (fVar47 * fVar64 + fVar50 * fVar83 + fVar124 * fVar103 + fVar34 * fVar90) * fVar19 +
              (fVar40 * fVar64 + fVar43 * fVar83 + fVar46 * fVar103 + fVar49 * fVar90) * fVar33 +
              (fVar52 * fVar64 + fVar54 * fVar83 + fVar55 * fVar103 + fVar27 * fVar90) * fVar58 +
              (fVar112 * fVar64 + fVar29 * fVar83 + fVar114 * fVar103 + fVar31 * fVar90) * fVar67;
    fVar118 = (fVar47 * fVar73 + fVar50 * fVar99 + fVar124 * fVar87 + fVar34 * fVar91) * fVar23 +
              (fVar40 * fVar73 + fVar43 * fVar99 + fVar46 * fVar87 + fVar49 * fVar91) * fVar39 +
              (fVar52 * fVar73 + fVar54 * fVar99 + fVar55 * fVar87 + fVar27 * fVar91) * fVar59 +
              (fVar112 * fVar73 + fVar29 * fVar99 + fVar114 * fVar87 + fVar31 * fVar91) * fVar68;
    fVar119 = (fVar47 * fVar78 + fVar50 * fVar84 + fVar124 * fVar104 + fVar34 * fVar93) * fVar24 +
              (fVar40 * fVar78 + fVar43 * fVar84 + fVar46 * fVar104 + fVar49 * fVar93) * fVar42 +
              (fVar52 * fVar78 + fVar54 * fVar84 + fVar55 * fVar104 + fVar27 * fVar93) * fVar60 +
              (fVar112 * fVar78 + fVar29 * fVar84 + fVar114 * fVar104 + fVar31 * fVar93) * fVar69;
    fVar120 = (fVar47 * fVar79 + fVar50 * fVar101 + fVar124 * fVar88 + fVar34 * fVar94) * fVar25 +
              (fVar40 * fVar79 + fVar43 * fVar101 + fVar46 * fVar88 + fVar49 * fVar94) * fVar45 +
              (fVar52 * fVar79 + fVar54 * fVar101 + fVar55 * fVar88 + fVar27 * fVar94) * fVar61 +
              (fVar112 * fVar79 + fVar29 * fVar101 + fVar114 * fVar88 + fVar31 * fVar94) * fVar70;
    fVar121 = (fVar47 * fVar80 + fVar50 * fVar85 + fVar124 * fVar105 + fVar34 * fVar95) * fVar26 +
              (fVar40 * fVar80 + fVar43 * fVar85 + fVar46 * fVar105 + fVar49 * fVar95) * fVar48 +
              (fVar52 * fVar80 + fVar54 * fVar85 + fVar55 * fVar105 + fVar27 * fVar95) * fVar62 +
              (fVar112 * fVar80 + fVar29 * fVar85 + fVar114 * fVar105 + fVar31 * fVar95) * fVar71;
    fVar122 = (fVar47 * fVar81 + fVar50 * fVar102 + fVar124 * fVar89 + fVar34 * fVar96) * fVar28 +
              (fVar40 * fVar81 + fVar43 * fVar102 + fVar46 * fVar89 + fVar49 * fVar96) * fVar51 +
              (fVar52 * fVar81 + fVar54 * fVar102 + fVar55 * fVar89 + fVar27 * fVar96) * fVar63 +
              (fVar112 * fVar81 + fVar29 * fVar102 + fVar114 * fVar89 + fVar31 * fVar96) * fVar72;
    fVar123 = (fVar47 * fVar82 + fVar50 * fVar86 + fVar124 * fVar106 + fVar34 * fVar97) * fVar30 +
              (fVar40 * fVar82 + fVar43 * fVar86 + fVar46 * fVar106 + fVar49 * fVar97) * fVar56 +
              (fVar52 * fVar82 + fVar54 * fVar86 + fVar55 * fVar106 + fVar27 * fVar97) * fVar53 +
              (fVar112 * fVar82 + fVar29 * fVar86 + fVar114 * fVar106 + fVar31 * fVar97) * fVar137;
    fVar124 = fVar47 + fVar50 + fVar124 + fVar34 +
              fVar40 + fVar138 +
              fVar52 + fVar54 + fVar55 + fVar138 + fVar112 + fVar29 + fVar114 + fVar31;
    fVar34 = patch->patch_v[0][0].field_0.m128[2];
    fVar40 = patch->patch_v[1][0].field_0.m128[2];
    fVar43 = patch->patch_v[2][0].field_0.m128[2];
    fVar46 = patch->patch_v[3][0].field_0.m128[2];
    fVar54 = patch->patch_v[0][1].field_0.m128[2];
    fVar55 = patch->patch_v[1][1].field_0.m128[2];
    fVar27 = patch->patch_v[2][1].field_0.m128[2];
    fVar112 = patch->patch_v[3][1].field_0.m128[2];
    auVar126._0_4_ = fVar34 * fVar64 + fVar40 * fVar83 + fVar43 * fVar103 + fVar46 * fVar90;
    auVar126._4_4_ = fVar34 * fVar73 + fVar40 * fVar99 + fVar43 * fVar87 + fVar46 * fVar91;
    auVar126._8_4_ = fVar34 * fVar78 + fVar40 * fVar84 + fVar43 * fVar104 + fVar46 * fVar93;
    auVar126._12_4_ = fVar34 * fVar79 + fVar40 * fVar101 + fVar43 * fVar88 + fVar46 * fVar94;
    auVar126._16_4_ = fVar34 * fVar80 + fVar40 * fVar85 + fVar43 * fVar105 + fVar46 * fVar95;
    auVar126._20_4_ = fVar34 * fVar81 + fVar40 * fVar102 + fVar43 * fVar89 + fVar46 * fVar96;
    auVar126._24_4_ = fVar34 * fVar82 + fVar40 * fVar86 + fVar43 * fVar106 + fVar46 * fVar97;
    fVar29 = patch->patch_v[0][2].field_0.m128[2];
    fVar114 = patch->patch_v[2][2].field_0.m128[2];
    fVar31 = patch->patch_v[3][2].field_0.m128[2];
    fVar138 = patch->patch_v[1][2].field_0.m128[2];
    fVar41 = patch->patch_v[3][3].field_0.m128[2];
    fVar44 = patch->patch_v[2][3].field_0.m128[2];
    fVar47 = patch->patch_v[1][3].field_0.m128[2];
    fVar50 = patch->patch_v[0][3].field_0.m128[2];
    fVar34 = (fVar54 * fVar64 + fVar55 * fVar83 + fVar27 * fVar103 + fVar112 * fVar90) * fVar33 +
             (fVar29 * fVar64 + fVar138 * fVar83 + fVar114 * fVar103 + fVar31 * fVar90) * fVar58 +
             fVar67 * (fVar64 * fVar50 + fVar83 * fVar47 + fVar44 * fVar103 + fVar41 * fVar90);
    fVar40 = (fVar54 * fVar73 + fVar55 * fVar99 + fVar27 * fVar87 + fVar112 * fVar91) * fVar39 +
             (fVar29 * fVar73 + fVar138 * fVar99 + fVar114 * fVar87 + fVar31 * fVar91) * fVar59 +
             fVar68 * (fVar73 * fVar50 + fVar99 * fVar47 + fVar44 * fVar87 + fVar41 * fVar91);
    fVar43 = (fVar54 * fVar78 + fVar55 * fVar84 + fVar27 * fVar104 + fVar112 * fVar93) * fVar42 +
             (fVar29 * fVar78 + fVar138 * fVar84 + fVar114 * fVar104 + fVar31 * fVar93) * fVar60 +
             fVar69 * (fVar78 * fVar50 + fVar84 * fVar47 + fVar44 * fVar104 + fVar41 * fVar93);
    fVar46 = (fVar54 * fVar79 + fVar55 * fVar101 + fVar27 * fVar88 + fVar112 * fVar94) * fVar45 +
             (fVar29 * fVar79 + fVar138 * fVar101 + fVar114 * fVar88 + fVar31 * fVar94) * fVar61 +
             fVar70 * (fVar79 * fVar50 + fVar101 * fVar47 + fVar44 * fVar88 + fVar41 * fVar94);
    fVar49 = (fVar54 * fVar80 + fVar55 * fVar85 + fVar27 * fVar105 + fVar112 * fVar95) * fVar48 +
             (fVar29 * fVar80 + fVar138 * fVar85 + fVar114 * fVar105 + fVar31 * fVar95) * fVar62 +
             fVar71 * (fVar80 * fVar50 + fVar85 * fVar47 + fVar44 * fVar105 + fVar41 * fVar95);
    fVar52 = (fVar54 * fVar81 + fVar55 * fVar102 + fVar27 * fVar89 + fVar112 * fVar96) * fVar51 +
             (fVar29 * fVar81 + fVar138 * fVar102 + fVar114 * fVar89 + fVar31 * fVar96) * fVar63 +
             fVar72 * (fVar81 * fVar50 + fVar102 * fVar47 + fVar44 * fVar89 + fVar41 * fVar96);
    fVar54 = (fVar54 * fVar82 + fVar55 * fVar86 + fVar27 * fVar106 + fVar112 * fVar97) * fVar56 +
             (fVar29 * fVar82 + fVar138 * fVar86 + fVar114 * fVar106 + fVar31 * fVar97) * fVar53 +
             fVar137 * (fVar82 * fVar50 + fVar86 * fVar47 + fVar44 * fVar106 + fVar41 * fVar97);
    fVar55 = auVar1._28_4_ +
             in_register_0000129c +
             in_register_0000145c + in_register_0000149c +
             in_register_0000141c + in_register_000012dc;
  }
  fVar34 = auVar126._0_4_ * fVar19 + fVar34;
  fVar40 = auVar126._4_4_ * fVar23 + fVar40;
  fVar43 = auVar126._8_4_ * fVar24 + fVar43;
  fVar46 = auVar126._12_4_ * fVar25 + fVar46;
  fVar49 = auVar126._16_4_ * fVar26 + fVar49;
  fVar52 = auVar126._20_4_ * fVar28 + fVar52;
  fVar54 = auVar126._24_4_ * fVar30 + fVar54;
  fVar32 = fVar32 + fVar55;
  *(float *)&in_RDI->field_0 = fVar107;
  *(float *)((long)&in_RDI->field_0 + 4) = fVar108;
  *(float *)((long)&in_RDI->field_0 + 8) = fVar109;
  *(float *)((long)&in_RDI->field_0 + 0xc) = fVar110;
  *(float *)((long)&in_RDI->field_0 + 0x10) = fVar111;
  *(float *)((long)&in_RDI->field_0 + 0x14) = fVar113;
  *(float *)((long)&in_RDI->field_0 + 0x18) = fVar115;
  *(float *)((long)&in_RDI->field_0 + 0x1c) = fVar116;
  *(float *)((long)&in_RDI->field_0 + 0x20) = fVar117;
  *(float *)((long)&in_RDI->field_0 + 0x24) = fVar118;
  *(float *)((long)&in_RDI->field_0 + 0x28) = fVar119;
  *(float *)((long)&in_RDI->field_0 + 0x2c) = fVar120;
  *(float *)((long)&in_RDI->field_0 + 0x30) = fVar121;
  *(float *)((long)&in_RDI->field_0 + 0x34) = fVar122;
  *(float *)((long)&in_RDI->field_0 + 0x38) = fVar123;
  *(float *)((long)&in_RDI->field_0 + 0x3c) = fVar124;
LAB_0150b055:
  *(float *)((long)&in_RDI->field_0 + 0x40) = fVar34;
  *(float *)((long)&in_RDI->field_0 + 0x44) = fVar40;
  *(float *)((long)&in_RDI->field_0 + 0x48) = fVar43;
  *(float *)((long)&in_RDI->field_0 + 0x4c) = fVar46;
  *(float *)((long)&in_RDI->field_0 + 0x50) = fVar49;
  *(float *)((long)&in_RDI->field_0 + 0x54) = fVar52;
  *(float *)((long)&in_RDI->field_0 + 0x58) = fVar54;
  *(float *)((long)&in_RDI->field_0 + 0x5c) = fVar32;
  return in_RDI;
}

Assistant:

Vec3<simdf> patchEval(const SubdivPatch1Base& patch, const simdf& uu, const simdf& vv) 
    {
      if (likely(patch.type == SubdivPatch1Base::BEZIER_PATCH))
        return ((BezierPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BSPLINE_PATCH))
        return ((BSplinePatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::GREGORY_PATCH))
        return ((DenseGregoryPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BILINEAR_PATCH))
        return ((BilinearPatch3fa*)patch.patch_v)->eval(uu,vv);
      return Vec3<simdf>( zero );
    }